

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void polyscope::view::processRotate(vec2 startP,vec2 endP)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [48];
  long lVar11;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar38 [48];
  undefined1 auVar33 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar72;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 in_register_00001208 [56];
  undefined1 auVar73 [56];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  double dVar43;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  undefined1 auVar71 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_register_00001248 [56];
  float fVar81;
  float fVar82;
  float fVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar91;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar92;
  float fVar93;
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar215;
  float fVar216;
  float fVar221;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar222;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 in_ZMM19 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  vec3 vVar275;
  float a;
  vec3 frameRightDir;
  float a_4;
  float a_1;
  vec3 frameUpDir;
  vec3 frameLookDir;
  mat4x4 R;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float local_208;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_1f4;
  float local_1f0;
  float local_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  undefined1 local_1b8 [64];
  undefined1 local_178 [64];
  undefined1 local_138 [16];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  vec3 local_a4;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_98;
  uint uStack_94;
  uint local_90 [6];
  float local_78;
  float local_74;
  uint uStack_70;
  uint local_6c;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  undefined1 auVar34 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  auVar18 = in_ZMM19._0_16_;
  auVar38 = in_ZmmResult._16_48_;
  auVar36._8_56_ = in_register_00001248;
  auVar36._0_8_ = endP;
  auVar35._8_56_ = in_register_00001208;
  auVar35._0_8_ = startP;
  auVar24 = vmovshdup_avx(auVar35._0_16_);
  auVar20 = vmovshdup_avx(auVar36._0_16_);
  fVar216 = auVar24._0_4_;
  fVar221 = auVar20._0_4_;
  if ((startP.field_0.x == endP.field_0.x) && (!NAN(startP.field_0.x) && !NAN(endP.field_0.x))) {
    if ((fVar216 == fVar221) && (!NAN(fVar216) && !NAN(fVar221))) {
      return;
    }
  }
  local_178._0_16_ = auVar35._0_16_;
  local_1b8._0_16_ = auVar36._0_16_;
  getCameraFrame(&local_a4,(vec3 *)&local_104,(vec3 *)&local_1f4);
  auVar10 = local_178._16_48_;
  switch(style) {
  case 0:
    local_178._0_4_ =
         (float)(((double)((float)local_1b8._0_4_ - (float)local_178._0_4_) +
                 (double)((float)local_1b8._0_4_ - (float)local_178._0_4_)) * moveScale);
    dVar43 = ((double)(fVar221 - fVar216) + (double)(fVar221 - fVar216)) * moveScale;
    local_1b8._4_4_ = (int)((ulong)dVar43 >> 0x20);
    local_1b8._0_4_ = (float)dVar43;
    auVar73 = ZEXT856(0);
    local_1b8._8_8_ = 0;
    vVar275 = state::center();
    aVar74 = vVar275.field_2;
    auVar65._0_8_ = vVar275._0_8_;
    auVar65._8_56_ = auVar73;
    aVar39 = vVar275.field_0;
    auVar24 = vmovshdup_avx(auVar65._0_16_);
    auVar44._0_4_ =
         aVar39.x * viewMat._8_4_ + auVar24._0_4_ * viewMat._24_4_ + aVar74.z * viewMat._40_4_ +
         viewMat._56_4_;
    auVar44._4_4_ =
         aVar39.x * viewMat._12_4_ + auVar24._4_4_ * viewMat._28_4_ + aVar74.z * viewMat._44_4_ +
         viewMat._60_4_;
    auVar44._8_4_ = aVar39.x * 0.0 + auVar24._8_4_ * 0.0 + aVar74.z * 0.0 + 0.0;
    auVar44._12_4_ = aVar39.x * 0.0 + auVar24._12_4_ * 0.0 + aVar74.z * 0.0 + 0.0;
    auVar83._0_4_ =
         viewMat._48_4_ +
         aVar39.x * (float)viewMat + auVar24._0_4_ * viewMat._16_4_ + aVar74.z * viewMat._32_4_;
    auVar83._4_4_ =
         viewMat._52_4_ +
         aVar39.x * viewMat._4_4_ + auVar24._4_4_ * viewMat._20_4_ + aVar74.z * viewMat._36_4_;
    auVar83._8_4_ = aVar39.x * 0.0 + auVar24._8_4_ * 0.0 + aVar74.z * 0.0 + 0.0;
    auVar83._12_4_ = aVar39.x * 0.0 + auVar24._12_4_ * 0.0 + aVar74.z * 0.0 + 0.0;
    auVar24 = vmovlhps_avx(auVar83,auVar44);
    _DAT_005fc6b4 = auVar24;
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar24 = vxorps_avx512vl(local_1b8._0_16_,auVar7);
    fVar216 = cosf(auVar24._0_4_);
    local_1b8._0_4_ = fVar216;
    fVar82 = sinf(auVar24._0_4_);
    auVar19 = ZEXT416((uint)local_1b8._0_4_);
    auVar24 = ZEXT416((uint)(local_1f4.x * local_1f4.x + local_1f0 * local_1f0 +
                            local_1ec * local_1ec));
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    auVar24 = vdivss_avx512f(ZEXT416(0x3f800000),auVar24);
    fVar221 = auVar24._0_4_;
    local_1f0 = local_1f0 * fVar221;
    fVar216 = local_1f4.x * fVar221;
    local_1ec = local_1ec * fVar221;
    auVar24 = vsubss_avx512f(ZEXT416(0x3f800000),auVar19);
    fVar222 = auVar24._0_4_;
    fVar221 = fVar222 * fVar216;
    auVar31 = ZEXT416((uint)fVar216);
    fVar41 = fVar222 * local_1f0;
    fVar222 = fVar222 * local_1ec;
    auVar24 = vfmadd213ss_fma(auVar31,ZEXT416((uint)fVar221),ZEXT416((uint)local_1b8._0_4_));
    auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_1f0),ZEXT416((uint)fVar41),auVar19);
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_1f0),ZEXT416((uint)fVar221),
                              ZEXT416((uint)(fVar82 * local_1ec)));
    auVar27 = ZEXT416((uint)local_1ec);
    auVar29 = vfmsub213ss_fma(ZEXT416((uint)fVar221),auVar27,ZEXT416((uint)(fVar82 * local_1f0)));
    auVar17 = vfmsub231ss_fma(ZEXT416((uint)(fVar82 * local_1ec)),ZEXT416((uint)fVar41),auVar31);
    auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar27,ZEXT416((uint)(fVar82 * fVar216)));
    auVar31 = vfmadd213ss_fma(auVar31,ZEXT416((uint)fVar222),ZEXT416((uint)(fVar82 * local_1f0)));
    auVar30 = vfmsub213ss_fma(ZEXT416((uint)local_1f0),ZEXT416((uint)fVar222),
                              ZEXT416((uint)(fVar82 * fVar216)));
    auVar27 = vfmadd213ss_fma(auVar27,ZEXT416((uint)fVar222),auVar19);
    fVar41 = auVar24._0_4_ * 0.0;
    fVar156 = auVar20._0_4_ * 0.0;
    fVar221 = auVar18._0_4_ * 0.0;
    fVar93 = auVar30._0_4_ * 0.0;
    fVar216 = fVar41 + fVar221;
    fVar82 = auVar29._0_4_ * 0.0;
    fVar221 = fVar82 + auVar24._0_4_ + fVar221;
    fVar41 = auVar18._0_4_ + fVar41 + fVar82;
    fVar222 = auVar29._0_4_ + fVar216;
    fVar82 = fVar82 + fVar216;
    fVar91 = auVar17._0_4_ * 0.0;
    fVar216 = fVar156 + fVar91;
    fVar99 = auVar28._0_4_ * 0.0;
    auVar147._4_4_ = fVar221;
    auVar147._0_4_ = fVar221;
    auVar147._8_4_ = fVar221;
    auVar147._12_4_ = fVar221;
    auVar166._4_4_ = fVar41;
    auVar166._0_4_ = fVar41;
    auVar166._8_4_ = fVar41;
    auVar166._12_4_ = fVar41;
    auVar113._4_4_ = fVar222;
    auVar113._0_4_ = fVar222;
    auVar113._8_4_ = fVar222;
    auVar113._12_4_ = fVar222;
    auVar100._4_4_ = fVar82;
    auVar100._0_4_ = fVar82;
    auVar100._8_4_ = fVar82;
    auVar100._12_4_ = fVar82;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = viewMat;
    auVar24 = vmulps_avx512vl(auVar223,auVar147);
    auVar231._8_8_ = 0;
    auVar231._0_8_ = DAT_005fc694;
    auVar18 = vmulps_avx512vl(auVar231,auVar166);
    fVar42 = auVar28._0_4_ + fVar216;
    fVar156 = fVar99 + auVar17._0_4_ + fVar156;
    fVar91 = fVar99 + auVar20._0_4_ + fVar91;
    fVar99 = fVar99 + fVar216;
    fVar146 = auVar31._0_4_ * 0.0;
    auVar24 = vaddps_avx512vl(auVar24,auVar18);
    auVar239._8_8_ = 0;
    auVar239._0_8_ = DAT_005fc6a4;
    auVar20 = vmulps_avx512vl(auVar239,auVar113);
    fVar216 = fVar93 + fVar146;
    fVar215 = auVar27._0_4_ * 0.0;
    auVar129._4_4_ = fVar42;
    auVar129._0_4_ = fVar42;
    auVar129._8_4_ = fVar42;
    auVar129._12_4_ = fVar42;
    auVar24 = vaddps_avx512vl(auVar20,auVar24);
    auVar247._8_8_ = 0;
    auVar247._0_8_ = DAT_005fc6b4;
    auVar20 = vmulps_avx512vl(auVar247,auVar100);
    fVar93 = fVar215 + fVar93 + auVar31._0_4_;
    fVar146 = fVar215 + auVar30._0_4_ + fVar146;
    fVar165 = auVar27._0_4_ + fVar216;
    fVar215 = fVar215 + fVar216;
    auVar24 = vaddps_avx512vl(auVar20,auVar24);
    fVar40 = viewMat._8_4_;
    fVar72 = viewMat._12_4_;
    fVar216 = viewMat._24_4_;
    fVar2 = viewMat._28_4_;
    fVar81 = viewMat._40_4_;
    fVar90 = viewMat._44_4_;
    fVar92 = viewMat._56_4_;
    fVar98 = viewMat._60_4_;
    auVar101._0_4_ = fVar92 * fVar82 + fVar81 * fVar222 + fVar41 * fVar216 + fVar40 * fVar221;
    auVar101._4_4_ = fVar98 * fVar82 + fVar90 * fVar222 + fVar41 * fVar2 + fVar72 * fVar221;
    auVar101._8_4_ = fVar82 * 0.0 + fVar222 * 0.0 + fVar41 * 0.0 + fVar221 * 0.0;
    auVar101._12_4_ = fVar82 * 0.0 + fVar222 * 0.0 + fVar41 * 0.0 + fVar221 * 0.0;
    auVar114._4_4_ = fVar156;
    auVar114._0_4_ = fVar156;
    auVar114._8_4_ = fVar156;
    auVar114._12_4_ = fVar156;
    auVar157._4_4_ = fVar91;
    auVar157._0_4_ = fVar91;
    auVar157._8_4_ = fVar91;
    auVar157._12_4_ = fVar91;
    auVar20 = vmulps_avx512vl(auVar223,auVar114);
    auVar18 = vmulps_avx512vl(auVar231,auVar157);
    auVar28 = vmulps_avx512vl(auVar239,auVar129);
    auVar167._4_4_ = fVar99;
    auVar167._0_4_ = fVar99;
    auVar167._8_4_ = fVar99;
    auVar167._12_4_ = fVar99;
    auVar31 = vmulps_avx512vl(auVar247,auVar167);
    auVar168._4_4_ = fVar146;
    auVar168._0_4_ = fVar146;
    auVar168._8_4_ = fVar146;
    auVar168._12_4_ = fVar146;
    auVar115._0_4_ = fVar99 * fVar92 + fVar81 * fVar42 + fVar91 * fVar216 + fVar40 * fVar156;
    auVar115._4_4_ = fVar99 * fVar98 + fVar90 * fVar42 + fVar91 * fVar2 + fVar72 * fVar156;
    auVar115._8_4_ = fVar99 * 0.0 + fVar42 * 0.0 + fVar91 * 0.0 + fVar156 * 0.0;
    auVar115._12_4_ = fVar99 * 0.0 + fVar42 * 0.0 + fVar91 * 0.0 + fVar156 * 0.0;
    auVar130._4_4_ = fVar93;
    auVar130._0_4_ = fVar93;
    auVar130._8_4_ = fVar93;
    auVar130._12_4_ = fVar93;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = DAT_005fc694;
    auVar27 = vmulps_avx512vl(auVar232,auVar168);
    auVar224._8_8_ = 0;
    auVar224._0_8_ = viewMat;
    auVar29 = vmulps_avx512vl(auVar224,auVar130);
    auVar186._4_4_ = fVar165;
    auVar186._0_4_ = fVar165;
    auVar186._8_4_ = fVar165;
    auVar186._12_4_ = fVar165;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = DAT_005fc6a4;
    auVar30 = vmulps_avx512vl(auVar240,auVar186);
    auVar195._4_4_ = fVar215;
    auVar195._0_4_ = fVar215;
    auVar195._8_4_ = fVar215;
    auVar195._12_4_ = fVar215;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = DAT_005fc6b4;
    auVar17 = vmulps_avx512vl(auVar248,auVar195);
    auVar22 = ZEXT416(0) << 0x20;
    auVar19 = vmulps_avx512vl(auVar232,auVar22);
    auVar131._0_4_ = fVar215 * fVar92 + fVar165 * fVar81 + fVar146 * fVar216 + fVar40 * fVar93;
    auVar131._4_4_ = fVar215 * fVar98 + fVar165 * fVar90 + fVar146 * fVar2 + fVar72 * fVar93;
    auVar131._8_4_ = fVar215 * 0.0 + fVar165 * 0.0 + fVar146 * 0.0 + fVar93 * 0.0;
    auVar131._12_4_ = fVar215 * 0.0 + fVar165 * 0.0 + fVar146 * 0.0 + fVar93 * 0.0;
    auVar21 = vmulps_avx512vl(auVar224,auVar22);
    auVar35 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar31._12_4_ +
                                            auVar28._12_4_ + auVar18._12_4_ + auVar20._12_4_,
                                            CONCAT48(auVar31._8_4_ +
                                                     auVar28._8_4_ + auVar18._8_4_ + auVar20._8_4_,
                                                     CONCAT44(auVar31._4_4_ +
                                                              auVar28._4_4_ +
                                                              auVar18._4_4_ + auVar20._4_4_,
                                                              auVar31._0_4_ +
                                                              auVar28._0_4_ +
                                                              auVar18._0_4_ + auVar20._0_4_)))),
                         auVar115,1);
    auVar20 = vmulps_avx512vl(auVar240,auVar22);
    vinsertf32x4_avx512f(ZEXT1664(auVar24),auVar101,1);
    auVar36 = vbroadcasti64x4_avx512f(_DAT_00336d40);
    auVar169._0_4_ = auVar21._0_4_ + auVar19._0_4_ + auVar20._0_4_;
    auVar169._4_4_ = auVar21._4_4_ + auVar19._4_4_ + auVar20._4_4_;
    auVar169._8_4_ = auVar21._8_4_ + auVar19._8_4_ + auVar20._8_4_;
    auVar169._12_4_ = auVar21._12_4_ + auVar19._12_4_ + auVar20._12_4_;
    auVar45._0_4_ = fVar40 * 0.0 + fVar216 * 0.0 + fVar81 * 0.0 + fVar92;
    auVar45._4_4_ = fVar72 * 0.0 + fVar2 * 0.0 + fVar90 * 0.0 + fVar98;
    auVar45._8_8_ = 0;
    auVar24 = vaddps_avx512vl(auVar169,auVar248);
    auVar32 = vpermt2pd_avx512f(_DAT_00336d60,auVar35._0_32_);
    vinsertf32x4_avx512f
              (ZEXT1664(CONCAT412(auVar17._12_4_ + auVar30._12_4_ + auVar29._12_4_ + auVar27._12_4_,
                                  CONCAT48(auVar17._8_4_ +
                                           auVar30._8_4_ + auVar29._8_4_ + auVar27._8_4_,
                                           CONCAT44(auVar17._4_4_ +
                                                    auVar30._4_4_ + auVar29._4_4_ + auVar27._4_4_,
                                                    auVar17._0_4_ +
                                                    auVar30._0_4_ + auVar29._0_4_ + auVar27._0_4_)))
                       ),auVar131,1);
    auVar35 = vinsertf32x4_avx512f(ZEXT1664(auVar24),auVar45,1);
    local_1b8 = vmovdqu64_avx512f(auVar36);
    auVar35 = vpermt2pd_avx512f(auVar36,auVar35);
    _viewMat = vinsertf64x4_avx512f(auVar35,auVar32,0);
    switch(upDir) {
    case 0:
      local_228._0_4_ = 0.0;
      _local_218 = SUB6416(ZEXT464(0x3f800000),0);
      break;
    case 1:
      local_228._0_4_ = 0.0;
      _local_218 = ZEXT816(0x3f80000000000000);
      break;
    case 2:
      _local_218 = ZEXT816(0);
      local_228._0_4_ = 1.0;
      break;
    case 3:
      local_228._0_4_ = 0.0;
      _local_218 = SUB6416(ZEXT464(0xbf800000),0);
      break;
    case 4:
      local_228._0_4_ = 0.0;
      _local_218 = ZEXT816(0xbf80000000000000);
      break;
    case 5:
      _local_218 = ZEXT816(0);
      local_228._0_4_ = -1.0;
      break;
    default:
      local_228._0_4_ = 0.0;
      _local_218 = ZEXT816(0);
    }
    fVar82 = cosf((float)local_178._0_4_);
    fVar42 = sinf((float)local_178._0_4_);
    auVar24 = vmovshdup_avx(_local_218);
    fVar216 = local_218._0_4_;
    auVar21 = ZEXT416((uint)fVar82);
    fVar221 = auVar24._0_4_;
    auVar24 = ZEXT416((uint)((float)local_228._0_4_ * (float)local_228._0_4_ +
                            fVar216 * fVar216 + fVar221 * fVar221));
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    fVar41 = 1.0 / auVar24._0_4_;
    fVar82 = 1.0 - fVar82;
    fVar216 = fVar216 * fVar41;
    fVar221 = fVar221 * fVar41;
    local_228._0_4_ = (float)local_228._0_4_ * fVar41;
    fVar41 = fVar82 * fVar216;
    auVar19 = ZEXT416((uint)fVar216);
    fVar222 = fVar82 * fVar221;
    fVar82 = fVar82 * (float)local_228._0_4_;
    auVar31 = ZEXT416((uint)fVar221);
    auVar24 = vfmadd213ss_fma(auVar19,ZEXT416((uint)fVar41),auVar21);
    auVar20 = vfmadd213ss_fma(auVar31,ZEXT416((uint)fVar222),auVar21);
    auVar18 = vfmadd213ss_fma(auVar31,ZEXT416((uint)fVar41),
                              ZEXT416((uint)(fVar42 * (float)local_228._0_4_)));
    auVar17 = vfmsub231ss_fma(ZEXT416((uint)(fVar42 * (float)local_228._0_4_)),
                              ZEXT416((uint)fVar222),auVar19);
    auVar27 = ZEXT416((uint)local_228._0_4_);
    auVar29 = vfmsub213ss_fma(ZEXT416((uint)fVar41),auVar27,ZEXT416((uint)(fVar42 * fVar221)));
    auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar222),auVar27,ZEXT416((uint)(fVar42 * fVar216)));
    auVar30 = vfmsub213ss_fma(auVar31,ZEXT416((uint)fVar82),ZEXT416((uint)(fVar42 * fVar216)));
    auVar31 = vfmadd213ss_fma(auVar19,ZEXT416((uint)fVar82),ZEXT416((uint)(fVar42 * fVar221)));
    auVar27 = vfmadd213ss_fma(auVar27,ZEXT416((uint)fVar82),auVar21);
    fVar222 = auVar24._0_4_ * 0.0;
    fVar156 = auVar20._0_4_ * 0.0;
    fVar41 = auVar18._0_4_ * 0.0;
    fVar93 = auVar30._0_4_ * 0.0;
    fVar216 = fVar41 + fVar222;
    fVar82 = auVar29._0_4_ * 0.0;
    fVar221 = auVar29._0_4_ + fVar216;
    fVar41 = fVar82 + fVar41 + auVar24._0_4_;
    fVar222 = fVar82 + auVar18._0_4_ + fVar222;
    fVar82 = fVar82 + fVar216;
    fVar91 = auVar17._0_4_ * 0.0;
    fVar216 = fVar91 + fVar156;
    fVar99 = auVar28._0_4_ * 0.0;
    auVar154._4_4_ = fVar41;
    auVar154._0_4_ = fVar41;
    auVar154._8_4_ = fVar41;
    auVar154._12_4_ = fVar41;
    auVar181._4_4_ = fVar222;
    auVar181._0_4_ = fVar222;
    auVar181._8_4_ = fVar222;
    auVar181._12_4_ = fVar222;
    auVar125._4_4_ = fVar221;
    auVar125._0_4_ = fVar221;
    auVar125._8_4_ = fVar221;
    auVar125._12_4_ = fVar221;
    auVar110._4_4_ = fVar82;
    auVar110._0_4_ = fVar82;
    auVar110._8_4_ = fVar82;
    auVar110._12_4_ = fVar82;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = viewMat;
    auVar24 = vmulps_avx512vl(auVar229,auVar154);
    auVar237._8_8_ = 0;
    auVar237._0_8_ = DAT_005fc694;
    auVar18 = vmulps_avx512vl(auVar237,auVar181);
    fVar42 = fVar216 + auVar28._0_4_;
    fVar156 = fVar99 + auVar17._0_4_ + fVar156;
    fVar91 = fVar99 + auVar20._0_4_ + fVar91;
    fVar99 = fVar99 + fVar216;
    fVar146 = auVar31._0_4_ * 0.0;
    fVar215 = auVar27._0_4_ * 0.0;
    auVar24 = vaddps_avx512vl(auVar24,auVar18);
    auVar245._8_8_ = 0;
    auVar245._0_8_ = DAT_005fc6a4;
    auVar20 = vmulps_avx512vl(auVar245,auVar125);
    fVar165 = fVar146 + fVar93;
    fVar216 = fVar215 + fVar93 + auVar31._0_4_;
    auVar142._4_4_ = fVar42;
    auVar142._0_4_ = fVar42;
    auVar142._8_4_ = fVar42;
    auVar142._12_4_ = fVar42;
    auVar24 = vaddps_avx512vl(auVar20,auVar24);
    auVar253._8_8_ = 0;
    auVar253._0_8_ = DAT_005fc6b4;
    auVar20 = vmulps_avx512vl(auVar253,auVar110);
    fVar93 = fVar165 + auVar27._0_4_;
    fVar146 = fVar215 + fVar146 + auVar30._0_4_;
    fVar165 = fVar165 + fVar215;
    auVar24 = vaddps_avx512vl(auVar20,auVar24);
    fVar92 = viewMat._56_4_;
    fVar98 = viewMat._60_4_;
    fVar40 = viewMat._8_4_;
    fVar72 = viewMat._12_4_;
    fVar215 = viewMat._24_4_;
    fVar2 = viewMat._28_4_;
    fVar81 = viewMat._40_4_;
    fVar90 = viewMat._44_4_;
    auVar111._0_4_ = fVar92 * fVar82 + fVar81 * fVar221 + fVar222 * fVar215 + fVar40 * fVar41;
    auVar111._4_4_ = fVar98 * fVar82 + fVar90 * fVar221 + fVar222 * fVar2 + fVar72 * fVar41;
    auVar111._8_4_ = fVar82 * 0.0 + fVar221 * 0.0 + fVar222 * 0.0 + fVar41 * 0.0;
    auVar111._12_4_ = fVar82 * 0.0 + fVar221 * 0.0 + fVar222 * 0.0 + fVar41 * 0.0;
    auVar126._4_4_ = fVar156;
    auVar126._0_4_ = fVar156;
    auVar126._8_4_ = fVar156;
    auVar126._12_4_ = fVar156;
    auVar162._4_4_ = fVar91;
    auVar162._0_4_ = fVar91;
    auVar162._8_4_ = fVar91;
    auVar162._12_4_ = fVar91;
    auVar20 = vmulps_avx512vl(auVar229,auVar126);
    auVar18 = vmulps_avx512vl(auVar237,auVar162);
    auVar28 = vmulps_avx512vl(auVar245,auVar142);
    auVar182._4_4_ = fVar99;
    auVar182._0_4_ = fVar99;
    auVar182._8_4_ = fVar99;
    auVar182._12_4_ = fVar99;
    auVar31 = vmulps_avx512vl(auVar253,auVar182);
    auVar183._4_4_ = fVar146;
    auVar183._0_4_ = fVar146;
    auVar183._8_4_ = fVar146;
    auVar183._12_4_ = fVar146;
    auVar127._0_4_ = fVar99 * fVar92 + fVar81 * fVar42 + fVar91 * fVar215 + fVar40 * fVar156;
    auVar127._4_4_ = fVar99 * fVar98 + fVar90 * fVar42 + fVar91 * fVar2 + fVar72 * fVar156;
    auVar127._8_4_ = fVar99 * 0.0 + fVar42 * 0.0 + fVar91 * 0.0 + fVar156 * 0.0;
    auVar127._12_4_ = fVar99 * 0.0 + fVar42 * 0.0 + fVar91 * 0.0 + fVar156 * 0.0;
    auVar143._4_4_ = fVar216;
    auVar143._0_4_ = fVar216;
    auVar143._8_4_ = fVar216;
    auVar143._12_4_ = fVar216;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = DAT_005fc694;
    auVar27 = vmulps_avx512vl(auVar238,auVar183);
    auVar230._8_8_ = 0;
    auVar230._0_8_ = viewMat;
    auVar29 = vmulps_avx512vl(auVar230,auVar143);
    auVar189._4_4_ = fVar93;
    auVar189._0_4_ = fVar93;
    auVar189._8_4_ = fVar93;
    auVar189._12_4_ = fVar93;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = DAT_005fc6a4;
    auVar30 = vmulps_avx512vl(auVar246,auVar189);
    auVar198._4_4_ = fVar165;
    auVar198._0_4_ = fVar165;
    auVar198._8_4_ = fVar165;
    auVar198._12_4_ = fVar165;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = DAT_005fc6b4;
    auVar17 = vmulps_avx512vl(auVar254,auVar198);
    auVar144._0_4_ = fVar165 * fVar92 + fVar93 * fVar81 + fVar146 * fVar215 + fVar40 * fVar216;
    auVar144._4_4_ = fVar165 * fVar98 + fVar93 * fVar90 + fVar146 * fVar2 + fVar72 * fVar216;
    auVar144._8_4_ = fVar165 * 0.0 + fVar93 * 0.0 + fVar146 * 0.0 + fVar216 * 0.0;
    auVar144._12_4_ = fVar165 * 0.0 + fVar93 * 0.0 + fVar146 * 0.0 + fVar216 * 0.0;
    auVar22 = ZEXT416(0) << 0x20;
    auVar19 = vmulps_avx512vl(auVar230,auVar22);
    auVar21 = vmulps_avx512vl(auVar238,auVar22);
    auVar22 = vmulps_avx512vl(auVar246,auVar22);
    auVar35 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar31._12_4_ +
                                            auVar28._12_4_ + auVar18._12_4_ + auVar20._12_4_,
                                            CONCAT48(auVar31._8_4_ +
                                                     auVar28._8_4_ + auVar18._8_4_ + auVar20._8_4_,
                                                     CONCAT44(auVar31._4_4_ +
                                                              auVar28._4_4_ +
                                                              auVar18._4_4_ + auVar20._4_4_,
                                                              auVar31._0_4_ +
                                                              auVar28._0_4_ +
                                                              auVar18._0_4_ + auVar20._0_4_)))),
                         auVar127,1);
    vinsertf32x4_avx512f(ZEXT1664(auVar24),auVar111,1);
    auVar190._0_4_ = auVar19._0_4_ + auVar21._0_4_ + auVar22._0_4_;
    auVar190._4_4_ = auVar19._4_4_ + auVar21._4_4_ + auVar22._4_4_;
    auVar190._8_4_ = auVar19._8_4_ + auVar21._8_4_ + auVar22._8_4_;
    auVar190._12_4_ = auVar19._12_4_ + auVar21._12_4_ + auVar22._12_4_;
    auVar62._0_4_ = fVar40 * 0.0 + fVar215 * 0.0 + fVar81 * 0.0 + fVar92;
    auVar62._4_4_ = fVar72 * 0.0 + fVar2 * 0.0 + fVar90 * 0.0 + fVar98;
    auVar62._8_8_ = 0;
    auVar24 = vaddps_avx512vl(auVar190,auVar254);
    auVar36 = vinsertf32x4_avx512f(ZEXT1664(auVar24),auVar62,1);
    auVar32 = vpermt2pd_avx512f(_DAT_00336d60,auVar35._0_32_);
    vinsertf32x4_avx512f
              (ZEXT1664(CONCAT412(auVar17._12_4_ + auVar30._12_4_ + auVar29._12_4_ + auVar27._12_4_,
                                  CONCAT48(auVar17._8_4_ +
                                           auVar30._8_4_ + auVar29._8_4_ + auVar27._8_4_,
                                           CONCAT44(auVar17._4_4_ +
                                                    auVar30._4_4_ + auVar29._4_4_ + auVar27._4_4_,
                                                    auVar17._0_4_ +
                                                    auVar30._0_4_ + auVar29._0_4_ + auVar27._0_4_)))
                       ),auVar144,1);
    auVar35 = local_1b8;
    goto LAB_001f8f0e;
  case 1:
    local_178._0_4_ =
         (float)(((double)((float)local_1b8._0_4_ - (float)local_178._0_4_) +
                 (double)((float)local_1b8._0_4_ - (float)local_178._0_4_)) * moveScale);
    dVar43 = ((double)(fVar221 - fVar216) + (double)(fVar221 - fVar216)) * moveScale;
    local_1b8._4_4_ = (int)((ulong)dVar43 >> 0x20);
    local_1b8._0_4_ = (float)dVar43;
    auVar73 = ZEXT856(0);
    local_1b8._8_8_ = 0;
    vVar275 = state::center();
    aVar74 = vVar275.field_2;
    auVar66._0_8_ = vVar275._0_8_;
    auVar66._8_56_ = auVar73;
    aVar39 = vVar275.field_0;
    auVar24 = vmovshdup_avx(auVar66._0_16_);
    auVar48._0_4_ =
         aVar39.x * viewMat._8_4_ + auVar24._0_4_ * viewMat._24_4_ + aVar74.z * viewMat._40_4_ +
         viewMat._56_4_;
    auVar48._4_4_ =
         aVar39.x * viewMat._12_4_ + auVar24._4_4_ * viewMat._28_4_ + aVar74.z * viewMat._44_4_ +
         viewMat._60_4_;
    auVar48._8_4_ = aVar39.x * 0.0 + auVar24._8_4_ * 0.0 + aVar74.z * 0.0 + 0.0;
    auVar48._12_4_ = aVar39.x * 0.0 + auVar24._12_4_ * 0.0 + aVar74.z * 0.0 + 0.0;
    auVar84._0_4_ =
         viewMat._48_4_ +
         aVar39.x * (float)viewMat + auVar24._0_4_ * viewMat._16_4_ + aVar74.z * viewMat._32_4_;
    auVar84._4_4_ =
         viewMat._52_4_ +
         aVar39.x * viewMat._4_4_ + auVar24._4_4_ * viewMat._20_4_ + aVar74.z * viewMat._36_4_;
    auVar84._8_4_ = aVar39.x * 0.0 + auVar24._8_4_ * 0.0 + aVar74.z * 0.0 + 0.0;
    auVar84._12_4_ = aVar39.x * 0.0 + auVar24._12_4_ * 0.0 + aVar74.z * 0.0 + 0.0;
    auVar24 = vmovlhps_avx(auVar84,auVar48);
    _DAT_005fc6b4 = auVar24;
    fVar222 = cosf((float)local_178._0_4_);
    fVar82 = sinf((float)local_178._0_4_);
    auVar19 = ZEXT416((uint)fVar222);
    auVar24 = ZEXT416((uint)(local_104.x * local_104.x + local_100 * local_100 + local_fc * local_fc
                            ));
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    fVar221 = 1.0 / auVar24._0_4_;
    local_100 = local_100 * fVar221;
    fVar216 = local_104.x * fVar221;
    local_fc = local_fc * fVar221;
    fVar222 = 1.0 - fVar222;
    fVar221 = fVar222 * fVar216;
    auVar31 = ZEXT416((uint)fVar216);
    fVar41 = fVar222 * local_100;
    fVar222 = fVar222 * local_fc;
    auVar24 = vfmadd213ss_fma(auVar31,ZEXT416((uint)fVar221),auVar19);
    auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_100),ZEXT416((uint)fVar41),auVar19);
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_100),ZEXT416((uint)fVar221),
                              ZEXT416((uint)(fVar82 * local_fc)));
    auVar27 = ZEXT416((uint)local_fc);
    auVar29 = vfmsub213ss_fma(ZEXT416((uint)fVar221),auVar27,ZEXT416((uint)(fVar82 * local_100)));
    auVar17 = vfmsub231ss_fma(ZEXT416((uint)(fVar82 * local_fc)),ZEXT416((uint)fVar41),auVar31);
    auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar27,ZEXT416((uint)(fVar82 * fVar216)));
    auVar31 = vfmadd213ss_fma(auVar31,ZEXT416((uint)fVar222),ZEXT416((uint)(fVar82 * local_100)));
    auVar30 = vfmsub213ss_fma(ZEXT416((uint)local_100),ZEXT416((uint)fVar222),
                              ZEXT416((uint)(fVar82 * fVar216)));
    auVar27 = vfmadd213ss_fma(auVar27,ZEXT416((uint)fVar222),auVar19);
    fVar41 = auVar24._0_4_ * 0.0;
    fVar156 = auVar20._0_4_ * 0.0;
    fVar221 = auVar18._0_4_ * 0.0;
    fVar93 = auVar30._0_4_ * 0.0;
    fVar216 = fVar41 + fVar221;
    fVar82 = auVar29._0_4_ * 0.0;
    fVar221 = fVar82 + auVar24._0_4_ + fVar221;
    fVar41 = auVar18._0_4_ + fVar41 + fVar82;
    fVar222 = auVar29._0_4_ + fVar216;
    fVar82 = fVar82 + fVar216;
    fVar91 = auVar17._0_4_ * 0.0;
    fVar216 = fVar156 + fVar91;
    fVar99 = auVar28._0_4_ * 0.0;
    auVar148._4_4_ = fVar221;
    auVar148._0_4_ = fVar221;
    auVar148._8_4_ = fVar221;
    auVar148._12_4_ = fVar221;
    auVar170._4_4_ = fVar41;
    auVar170._0_4_ = fVar41;
    auVar170._8_4_ = fVar41;
    auVar170._12_4_ = fVar41;
    auVar116._4_4_ = fVar222;
    auVar116._0_4_ = fVar222;
    auVar116._8_4_ = fVar222;
    auVar116._12_4_ = fVar222;
    auVar103._4_4_ = fVar82;
    auVar103._0_4_ = fVar82;
    auVar103._8_4_ = fVar82;
    auVar103._12_4_ = fVar82;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = viewMat;
    auVar24 = vmulps_avx512vl(auVar225,auVar148);
    auVar233._8_8_ = 0;
    auVar233._0_8_ = DAT_005fc694;
    auVar18 = vmulps_avx512vl(auVar233,auVar170);
    fVar42 = auVar28._0_4_ + fVar216;
    fVar156 = fVar99 + auVar17._0_4_ + fVar156;
    fVar91 = fVar99 + auVar20._0_4_ + fVar91;
    fVar99 = fVar99 + fVar216;
    fVar146 = auVar31._0_4_ * 0.0;
    auVar24 = vaddps_avx512vl(auVar24,auVar18);
    auVar241._8_8_ = 0;
    auVar241._0_8_ = DAT_005fc6a4;
    auVar20 = vmulps_avx512vl(auVar241,auVar116);
    fVar216 = fVar93 + fVar146;
    fVar215 = auVar27._0_4_ * 0.0;
    auVar133._4_4_ = fVar42;
    auVar133._0_4_ = fVar42;
    auVar133._8_4_ = fVar42;
    auVar133._12_4_ = fVar42;
    auVar24 = vaddps_avx512vl(auVar20,auVar24);
    auVar249._8_8_ = 0;
    auVar249._0_8_ = DAT_005fc6b4;
    auVar20 = vmulps_avx512vl(auVar249,auVar103);
    fVar93 = fVar215 + fVar93 + auVar31._0_4_;
    fVar146 = fVar215 + auVar30._0_4_ + fVar146;
    fVar165 = auVar27._0_4_ + fVar216;
    fVar215 = fVar215 + fVar216;
    auVar24 = vaddps_avx512vl(auVar20,auVar24);
    fVar40 = viewMat._8_4_;
    fVar72 = viewMat._12_4_;
    fVar216 = viewMat._24_4_;
    fVar2 = viewMat._28_4_;
    fVar81 = viewMat._40_4_;
    fVar90 = viewMat._44_4_;
    fVar92 = viewMat._56_4_;
    fVar98 = viewMat._60_4_;
    auVar104._0_4_ = fVar92 * fVar82 + fVar81 * fVar222 + fVar41 * fVar216 + fVar40 * fVar221;
    auVar104._4_4_ = fVar98 * fVar82 + fVar90 * fVar222 + fVar41 * fVar2 + fVar72 * fVar221;
    auVar104._8_4_ = fVar82 * 0.0 + fVar222 * 0.0 + fVar41 * 0.0 + fVar221 * 0.0;
    auVar104._12_4_ = fVar82 * 0.0 + fVar222 * 0.0 + fVar41 * 0.0 + fVar221 * 0.0;
    auVar117._4_4_ = fVar156;
    auVar117._0_4_ = fVar156;
    auVar117._8_4_ = fVar156;
    auVar117._12_4_ = fVar156;
    auVar158._4_4_ = fVar91;
    auVar158._0_4_ = fVar91;
    auVar158._8_4_ = fVar91;
    auVar158._12_4_ = fVar91;
    auVar20 = vmulps_avx512vl(auVar225,auVar117);
    auVar18 = vmulps_avx512vl(auVar233,auVar158);
    auVar28 = vmulps_avx512vl(auVar241,auVar133);
    auVar171._4_4_ = fVar99;
    auVar171._0_4_ = fVar99;
    auVar171._8_4_ = fVar99;
    auVar171._12_4_ = fVar99;
    auVar31 = vmulps_avx512vl(auVar249,auVar171);
    auVar172._4_4_ = fVar146;
    auVar172._0_4_ = fVar146;
    auVar172._8_4_ = fVar146;
    auVar172._12_4_ = fVar146;
    auVar118._0_4_ = fVar99 * fVar92 + fVar81 * fVar42 + fVar91 * fVar216 + fVar40 * fVar156;
    auVar118._4_4_ = fVar99 * fVar98 + fVar90 * fVar42 + fVar91 * fVar2 + fVar72 * fVar156;
    auVar118._8_4_ = fVar99 * 0.0 + fVar42 * 0.0 + fVar91 * 0.0 + fVar156 * 0.0;
    auVar118._12_4_ = fVar99 * 0.0 + fVar42 * 0.0 + fVar91 * 0.0 + fVar156 * 0.0;
    auVar134._4_4_ = fVar93;
    auVar134._0_4_ = fVar93;
    auVar134._8_4_ = fVar93;
    auVar134._12_4_ = fVar93;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = DAT_005fc694;
    auVar27 = vmulps_avx512vl(auVar234,auVar172);
    auVar226._8_8_ = 0;
    auVar226._0_8_ = viewMat;
    auVar29 = vmulps_avx512vl(auVar226,auVar134);
    auVar187._4_4_ = fVar165;
    auVar187._0_4_ = fVar165;
    auVar187._8_4_ = fVar165;
    auVar187._12_4_ = fVar165;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = DAT_005fc6a4;
    auVar30 = vmulps_avx512vl(auVar242,auVar187);
    auVar196._4_4_ = fVar215;
    auVar196._0_4_ = fVar215;
    auVar196._8_4_ = fVar215;
    auVar196._12_4_ = fVar215;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = DAT_005fc6b4;
    auVar17 = vmulps_avx512vl(auVar250,auVar196);
    auVar22 = ZEXT416(0) << 0x20;
    auVar19 = vmulps_avx512vl(auVar234,auVar22);
    auVar135._0_4_ = fVar215 * fVar92 + fVar165 * fVar81 + fVar146 * fVar216 + fVar40 * fVar93;
    auVar135._4_4_ = fVar215 * fVar98 + fVar165 * fVar90 + fVar146 * fVar2 + fVar72 * fVar93;
    auVar135._8_4_ = fVar215 * 0.0 + fVar165 * 0.0 + fVar146 * 0.0 + fVar93 * 0.0;
    auVar135._12_4_ = fVar215 * 0.0 + fVar165 * 0.0 + fVar146 * 0.0 + fVar93 * 0.0;
    auVar21 = vmulps_avx512vl(auVar226,auVar22);
    auVar35 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar31._12_4_ +
                                            auVar28._12_4_ + auVar18._12_4_ + auVar20._12_4_,
                                            CONCAT48(auVar31._8_4_ +
                                                     auVar28._8_4_ + auVar18._8_4_ + auVar20._8_4_,
                                                     CONCAT44(auVar31._4_4_ +
                                                              auVar28._4_4_ +
                                                              auVar18._4_4_ + auVar20._4_4_,
                                                              auVar31._0_4_ +
                                                              auVar28._0_4_ +
                                                              auVar18._0_4_ + auVar20._0_4_)))),
                         auVar118,1);
    auVar20 = vmulps_avx512vl(auVar242,auVar22);
    vinsertf32x4_avx512f(ZEXT1664(auVar24),auVar104,1);
    auVar36 = vbroadcasti64x4_avx512f(_DAT_00336d40);
    auVar173._0_4_ = auVar21._0_4_ + auVar19._0_4_ + auVar20._0_4_;
    auVar173._4_4_ = auVar21._4_4_ + auVar19._4_4_ + auVar20._4_4_;
    auVar173._8_4_ = auVar21._8_4_ + auVar19._8_4_ + auVar20._8_4_;
    auVar173._12_4_ = auVar21._12_4_ + auVar19._12_4_ + auVar20._12_4_;
    auVar49._0_4_ = fVar40 * 0.0 + fVar216 * 0.0 + fVar81 * 0.0 + fVar92;
    auVar49._4_4_ = fVar72 * 0.0 + fVar2 * 0.0 + fVar90 * 0.0 + fVar98;
    auVar49._8_8_ = 0;
    auVar24 = vaddps_avx512vl(auVar173,auVar250);
    auVar32 = vpermt2pd_avx512f(_DAT_00336d60,auVar35._0_32_);
    vinsertf32x4_avx512f
              (ZEXT1664(CONCAT412(auVar17._12_4_ + auVar30._12_4_ + auVar29._12_4_ + auVar27._12_4_,
                                  CONCAT48(auVar17._8_4_ +
                                           auVar30._8_4_ + auVar29._8_4_ + auVar27._8_4_,
                                           CONCAT44(auVar17._4_4_ +
                                                    auVar30._4_4_ + auVar29._4_4_ + auVar27._4_4_,
                                                    auVar17._0_4_ +
                                                    auVar30._0_4_ + auVar29._0_4_ + auVar27._0_4_)))
                       ),auVar135,1);
    auVar35 = vinsertf32x4_avx512f(ZEXT1664(auVar24),auVar49,1);
    local_178 = vmovdqu64_avx512f(auVar36);
    auVar35 = vpermt2pd_avx512f(auVar36,auVar35);
    _viewMat = vinsertf64x4_avx512f(auVar35,auVar32,0);
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar24 = vxorps_avx512vl(local_1b8._0_16_,auVar5);
    fVar216 = cosf(auVar24._0_4_);
    local_1b8._0_4_ = fVar216;
    fVar82 = sinf(auVar24._0_4_);
    auVar19 = ZEXT416((uint)local_1b8._0_4_);
    auVar24 = ZEXT416((uint)(local_1f4.x * local_1f4.x + local_1f0 * local_1f0 +
                            local_1ec * local_1ec));
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    fVar221 = 1.0 / auVar24._0_4_;
    local_1f0 = local_1f0 * fVar221;
    fVar216 = local_1f4.x * fVar221;
    local_1ec = local_1ec * fVar221;
    fVar222 = 1.0 - (float)local_1b8._0_4_;
    fVar221 = fVar222 * fVar216;
    auVar27 = ZEXT416((uint)fVar216);
    fVar41 = fVar222 * local_1f0;
    fVar222 = fVar222 * local_1ec;
    auVar30 = ZEXT416((uint)local_1f0);
    auVar24 = vfmadd213ss_fma(auVar27,ZEXT416((uint)fVar221),auVar19);
    auVar20 = vfmadd213ss_fma(auVar30,ZEXT416((uint)fVar41),auVar19);
    auVar18 = vfmadd213ss_fma(auVar30,ZEXT416((uint)fVar221),ZEXT416((uint)(fVar82 * local_1ec)));
    auVar17 = vfmsub231ss_fma(ZEXT416((uint)(fVar82 * local_1ec)),ZEXT416((uint)fVar41),auVar27);
    auVar31 = ZEXT416((uint)local_1ec);
    auVar29 = vfmsub213ss_fma(ZEXT416((uint)fVar221),auVar31,ZEXT416((uint)(fVar82 * local_1f0)));
    auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar41),auVar31,ZEXT416((uint)(fVar82 * fVar216)));
    auVar31 = vfmadd213ss_fma(auVar31,ZEXT416((uint)fVar222),auVar19);
    auVar27 = vfmadd213ss_fma(auVar27,ZEXT416((uint)fVar222),ZEXT416((uint)(fVar82 * local_1f0)));
    auVar30 = vfmsub213ss_fma(auVar30,ZEXT416((uint)fVar222),ZEXT416((uint)(fVar82 * fVar216)));
    fVar41 = auVar24._0_4_ * 0.0;
    fVar156 = auVar20._0_4_ * 0.0;
    fVar221 = auVar18._0_4_ * 0.0;
    fVar216 = fVar41 + fVar221;
    fVar82 = auVar29._0_4_ * 0.0;
    fVar221 = fVar82 + auVar24._0_4_ + fVar221;
    fVar41 = auVar18._0_4_ + fVar41 + fVar82;
    fVar222 = auVar29._0_4_ + fVar216;
    fVar82 = fVar82 + fVar216;
    fVar91 = auVar17._0_4_ * 0.0;
    fVar216 = fVar156 + fVar91;
    fVar99 = auVar28._0_4_ * 0.0;
    auVar149._4_4_ = fVar221;
    auVar149._0_4_ = fVar221;
    auVar149._8_4_ = fVar221;
    auVar149._12_4_ = fVar221;
    auVar174._4_4_ = fVar41;
    auVar174._0_4_ = fVar41;
    auVar174._8_4_ = fVar41;
    auVar174._12_4_ = fVar41;
    auVar119._4_4_ = fVar222;
    auVar119._0_4_ = fVar222;
    auVar119._8_4_ = fVar222;
    auVar119._12_4_ = fVar222;
    auVar105._4_4_ = fVar82;
    auVar105._0_4_ = fVar82;
    auVar105._8_4_ = fVar82;
    auVar105._12_4_ = fVar82;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = viewMat;
    auVar24 = vmulps_avx512vl(auVar227,auVar149);
    auVar235._8_8_ = 0;
    auVar235._0_8_ = DAT_005fc694;
    auVar18 = vmulps_avx512vl(auVar235,auVar174);
    fVar42 = auVar28._0_4_ + fVar216;
    fVar156 = fVar99 + auVar17._0_4_ + fVar156;
    fVar91 = fVar99 + auVar20._0_4_ + fVar91;
    fVar99 = fVar99 + fVar216;
    fVar146 = auVar27._0_4_ * 0.0;
    fVar93 = auVar30._0_4_ * 0.0;
    auVar24 = vaddps_avx512vl(auVar24,auVar18);
    auVar243._8_8_ = 0;
    auVar243._0_8_ = DAT_005fc6a4;
    auVar20 = vmulps_avx512vl(auVar243,auVar119);
    fVar216 = fVar93 + fVar146;
    fVar215 = auVar31._0_4_ * 0.0;
    auVar136._4_4_ = fVar42;
    auVar136._0_4_ = fVar42;
    auVar136._8_4_ = fVar42;
    auVar136._12_4_ = fVar42;
    auVar24 = vaddps_avx512vl(auVar20,auVar24);
    auVar251._8_8_ = 0;
    auVar251._0_8_ = DAT_005fc6b4;
    auVar20 = vmulps_avx512vl(auVar251,auVar105);
    fVar93 = fVar215 + fVar93 + auVar27._0_4_;
    fVar146 = fVar215 + auVar30._0_4_ + fVar146;
    fVar165 = auVar31._0_4_ + fVar216;
    fVar215 = fVar215 + fVar216;
    auVar24 = vaddps_avx512vl(auVar20,auVar24);
    fVar40 = viewMat._8_4_;
    fVar72 = viewMat._12_4_;
    fVar216 = viewMat._24_4_;
    fVar2 = viewMat._28_4_;
    fVar81 = viewMat._40_4_;
    fVar90 = viewMat._44_4_;
    fVar92 = viewMat._56_4_;
    fVar98 = viewMat._60_4_;
    auVar106._0_4_ = fVar92 * fVar82 + fVar81 * fVar222 + fVar41 * fVar216 + fVar40 * fVar221;
    auVar106._4_4_ = fVar98 * fVar82 + fVar90 * fVar222 + fVar41 * fVar2 + fVar72 * fVar221;
    auVar106._8_4_ = fVar82 * 0.0 + fVar222 * 0.0 + fVar41 * 0.0 + fVar221 * 0.0;
    auVar106._12_4_ = fVar82 * 0.0 + fVar222 * 0.0 + fVar41 * 0.0 + fVar221 * 0.0;
    auVar120._4_4_ = fVar156;
    auVar120._0_4_ = fVar156;
    auVar120._8_4_ = fVar156;
    auVar120._12_4_ = fVar156;
    auVar159._4_4_ = fVar91;
    auVar159._0_4_ = fVar91;
    auVar159._8_4_ = fVar91;
    auVar159._12_4_ = fVar91;
    auVar20 = vmulps_avx512vl(auVar227,auVar120);
    auVar18 = vmulps_avx512vl(auVar235,auVar159);
    auVar28 = vmulps_avx512vl(auVar243,auVar136);
    auVar175._4_4_ = fVar99;
    auVar175._0_4_ = fVar99;
    auVar175._8_4_ = fVar99;
    auVar175._12_4_ = fVar99;
    auVar31 = vmulps_avx512vl(auVar251,auVar175);
    auVar176._4_4_ = fVar146;
    auVar176._0_4_ = fVar146;
    auVar176._8_4_ = fVar146;
    auVar176._12_4_ = fVar146;
    auVar121._0_4_ = fVar99 * fVar92 + fVar81 * fVar42 + fVar91 * fVar216 + fVar40 * fVar156;
    auVar121._4_4_ = fVar99 * fVar98 + fVar90 * fVar42 + fVar91 * fVar2 + fVar72 * fVar156;
    auVar121._8_4_ = fVar99 * 0.0 + fVar42 * 0.0 + fVar91 * 0.0 + fVar156 * 0.0;
    auVar121._12_4_ = fVar99 * 0.0 + fVar42 * 0.0 + fVar91 * 0.0 + fVar156 * 0.0;
    auVar137._4_4_ = fVar93;
    auVar137._0_4_ = fVar93;
    auVar137._8_4_ = fVar93;
    auVar137._12_4_ = fVar93;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = DAT_005fc694;
    auVar27 = vmulps_avx512vl(auVar236,auVar176);
    auVar228._8_8_ = 0;
    auVar228._0_8_ = viewMat;
    auVar29 = vmulps_avx512vl(auVar228,auVar137);
    auVar188._4_4_ = fVar165;
    auVar188._0_4_ = fVar165;
    auVar188._8_4_ = fVar165;
    auVar188._12_4_ = fVar165;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = DAT_005fc6a4;
    auVar30 = vmulps_avx512vl(auVar244,auVar188);
    auVar197._4_4_ = fVar215;
    auVar197._0_4_ = fVar215;
    auVar197._8_4_ = fVar215;
    auVar197._12_4_ = fVar215;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = DAT_005fc6b4;
    auVar17 = vmulps_avx512vl(auVar252,auVar197);
    auVar22 = ZEXT416(0) << 0x20;
    auVar19 = vmulps_avx512vl(auVar236,auVar22);
    auVar138._0_4_ = fVar215 * fVar92 + fVar165 * fVar81 + fVar146 * fVar216 + fVar40 * fVar93;
    auVar138._4_4_ = fVar215 * fVar98 + fVar165 * fVar90 + fVar146 * fVar2 + fVar72 * fVar93;
    auVar138._8_4_ = fVar215 * 0.0 + fVar165 * 0.0 + fVar146 * 0.0 + fVar93 * 0.0;
    auVar138._12_4_ = fVar215 * 0.0 + fVar165 * 0.0 + fVar146 * 0.0 + fVar93 * 0.0;
    auVar21 = vmulps_avx512vl(auVar228,auVar22);
    auVar22 = vmulps_avx512vl(auVar244,auVar22);
    auVar177._0_4_ = auVar21._0_4_ + auVar19._0_4_ + auVar22._0_4_;
    auVar177._4_4_ = auVar21._4_4_ + auVar19._4_4_ + auVar22._4_4_;
    auVar177._8_4_ = auVar21._8_4_ + auVar19._8_4_ + auVar22._8_4_;
    auVar177._12_4_ = auVar21._12_4_ + auVar19._12_4_ + auVar22._12_4_;
    vinsertf32x4_avx512f(ZEXT1664(auVar24),auVar106,1);
    auVar24 = vaddps_avx512vl(auVar177,auVar252);
    auVar35 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar31._12_4_ +
                                            auVar28._12_4_ + auVar18._12_4_ + auVar20._12_4_,
                                            CONCAT48(auVar31._8_4_ +
                                                     auVar28._8_4_ + auVar18._8_4_ + auVar20._8_4_,
                                                     CONCAT44(auVar31._4_4_ +
                                                              auVar28._4_4_ +
                                                              auVar18._4_4_ + auVar20._4_4_,
                                                              auVar31._0_4_ +
                                                              auVar28._0_4_ +
                                                              auVar18._0_4_ + auVar20._0_4_)))),
                         auVar121,1);
    auVar50._0_4_ = fVar40 * 0.0 + fVar216 * 0.0 + fVar81 * 0.0 + fVar92;
    auVar50._4_4_ = fVar72 * 0.0 + fVar2 * 0.0 + fVar90 * 0.0 + fVar98;
    auVar50._8_8_ = 0;
    auVar32 = vpermt2pd_avx512f(_DAT_00336d60,auVar35._0_32_);
    vinsertf32x4_avx512f
              (ZEXT1664(CONCAT412(auVar17._12_4_ + auVar30._12_4_ + auVar29._12_4_ + auVar27._12_4_,
                                  CONCAT48(auVar17._8_4_ +
                                           auVar30._8_4_ + auVar29._8_4_ + auVar27._8_4_,
                                           CONCAT44(auVar17._4_4_ +
                                                    auVar30._4_4_ + auVar29._4_4_ + auVar27._4_4_,
                                                    auVar17._0_4_ +
                                                    auVar30._0_4_ + auVar29._0_4_ + auVar27._0_4_)))
                       ),auVar138,1);
    auVar36 = vinsertf32x4_avx512f(ZEXT1664(auVar24),auVar50,1);
    auVar35 = local_178;
LAB_001f8f0e:
    auVar35 = vpermt2pd_avx512f(auVar35,auVar36);
    _viewMat = vinsertf64x4_avx512f(auVar35,auVar32,0);
    auVar73 = ZEXT856(viewMat._8_8_);
    vVar275 = state::center();
    aVar74 = vVar275.field_2;
    auVar70._0_8_ = vVar275._0_8_;
    auVar70._8_56_ = auVar73;
    auVar24 = vshufps_avx(auVar70._0_16_,auVar70._0_16_,0x55);
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar24 = vxorps_avx512vl(auVar24,auVar6);
    aVar39 = vVar275.field_0;
    auVar88._0_4_ = aVar39.x * (float)viewMat;
    auVar88._4_4_ = aVar39.x * viewMat._4_4_;
    auVar88._8_4_ = aVar39.x * 0.0;
    auVar88._12_4_ = aVar39.x * 0.0;
    auVar112._0_4_ = auVar24._0_4_ * viewMat._16_4_;
    auVar112._4_4_ = auVar24._4_4_ * viewMat._20_4_;
    auVar112._8_4_ = auVar24._8_4_ * 0.0;
    auVar112._12_4_ = auVar24._12_4_ * 0.0;
    auVar63._0_4_ = aVar39.x * viewMat._8_4_;
    auVar63._4_4_ = aVar39.x * viewMat._12_4_;
    auVar63._8_4_ = aVar39.x * 0.0;
    auVar63._12_4_ = aVar39.x * 0.0;
    auVar128._0_4_ = auVar24._0_4_ * viewMat._24_4_;
    auVar128._4_4_ = auVar24._4_4_ * viewMat._28_4_;
    auVar128._8_4_ = auVar24._8_4_ * 0.0;
    auVar128._12_4_ = auVar24._12_4_ * 0.0;
    auVar184._0_4_ = aVar74.z * viewMat._32_4_;
    auVar184._4_4_ = aVar74.z * viewMat._36_4_;
    auVar184._8_4_ = aVar74.z * 0.0;
    auVar184._12_4_ = aVar74.z * 0.0;
    auVar80._0_4_ = aVar74.z * viewMat._40_4_;
    auVar80._4_4_ = aVar74.z * viewMat._44_4_;
    auVar80._8_4_ = aVar74.z * 0.0;
    auVar80._12_4_ = aVar74.z * 0.0;
    auVar24 = vsubps_avx(auVar112,auVar88);
    auVar20 = vsubps_avx(auVar128,auVar63);
    auVar24 = vsubps_avx(auVar24,auVar184);
    auVar20 = vsubps_avx(auVar20,auVar80);
    auVar89._0_4_ = viewMat._48_4_ + auVar24._0_4_;
    auVar89._4_4_ = viewMat._52_4_ + auVar24._4_4_;
    auVar89._8_4_ = auVar24._8_4_ + 0.0;
    auVar89._12_4_ = auVar24._12_4_ + 0.0;
    auVar64._0_4_ = auVar20._0_4_ + viewMat._56_4_;
    auVar64._4_4_ = auVar20._4_4_ + viewMat._60_4_;
    auVar64._8_4_ = auVar20._8_4_ + 0.0;
    auVar64._12_4_ = auVar20._12_4_ + 0.0;
    auVar24 = vmovlhps_avx(auVar89,auVar64);
    _DAT_005fc6b4 = auVar24;
  default:
    goto switchD_001f7428_caseD_2;
  case 3:
    auVar102._8_4_ = 0xbf800000;
    auVar102._0_8_ = 0xbf800000bf800000;
    auVar102._12_4_ = 0xbf800000;
    auVar132._8_4_ = 0x3f800000;
    auVar132._0_8_ = 0x3f8000003f800000;
    auVar132._12_4_ = 0x3f800000;
    auVar24 = vmaxps_avx(auVar102,local_178._0_16_);
    local_178._0_16_ = vminps_avx(auVar132,auVar24);
    auVar24 = vmovshdup_avx(local_178._0_16_);
    fVar216 = local_178._0_4_;
    auVar75._0_8_ = (double)fVar216;
    auVar75._8_8_ = local_178._8_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = (double)auVar24._0_4_ * (double)auVar24._0_4_;
    auVar24 = vfmadd231sd_fma(auVar46,auVar75,auVar75);
    local_178._16_48_ = auVar10;
    if (auVar24._0_8_ <= 1.0) {
      dVar43 = 1.0 - auVar24._0_8_;
      if (dVar43 < 0.0) {
        auVar67._0_8_ = sqrt(dVar43);
        auVar67._8_56_ = extraout_var_02;
        auVar24 = auVar67._0_16_;
        auVar132._8_4_ = 0x3f800000;
        auVar132._0_8_ = 0x3f8000003f800000;
        auVar132._12_4_ = 0x3f800000;
        auVar102._8_4_ = 0xbf800000;
        auVar102._0_8_ = 0xbf800000bf800000;
        auVar102._12_4_ = 0xbf800000;
      }
      else {
        auVar51._8_8_ = 0;
        auVar51._0_8_ = dVar43;
        auVar24 = vsqrtsd_avx(auVar51,auVar51);
      }
      auVar52._0_4_ = (float)auVar24._0_8_;
      auVar52._4_12_ = auVar24._4_12_;
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar24 = vxorps_avx512vl(auVar52,auVar4);
      fVar221 = auVar24._0_4_;
    }
    else {
      auVar47._0_4_ = fVar216 * fVar216;
      fVar41 = local_178._4_4_;
      auVar47._4_4_ = fVar41 * fVar41;
      fVar222 = local_178._8_4_;
      auVar47._8_4_ = fVar222 * fVar222;
      fVar82 = local_178._12_4_;
      auVar47._12_4_ = fVar82 * fVar82;
      auVar24 = vhaddps_avx(auVar47,auVar47);
      auVar24 = vsqrtss_avx(auVar24,auVar24);
      fVar221 = 1.0 / auVar24._0_4_;
      local_178._0_4_ = fVar216 * fVar221;
      local_178._4_4_ = fVar41 * fVar221;
      local_178._8_4_ = fVar222 * fVar221;
      local_178._12_4_ = fVar82 * fVar221;
      fVar221 = fVar221 * 0.0;
    }
    auVar24 = vmaxps_avx(auVar102,local_1b8._0_16_);
    local_1b8._0_16_ = vminps_avx(auVar132,auVar24);
    auVar24 = vmovshdup_avx(local_1b8._0_16_);
    fVar216 = local_1b8._0_4_;
    auVar76._0_8_ = (double)fVar216;
    auVar76._8_8_ = local_1b8._8_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = (double)auVar24._0_4_ * (double)auVar24._0_4_;
    auVar24 = vfmadd231sd_fma(auVar53,auVar76,auVar76);
    if (auVar24._0_8_ <= 1.0) {
      dVar43 = 1.0 - auVar24._0_8_;
      if (dVar43 < 0.0) {
        auVar68._0_8_ = sqrt(dVar43);
        auVar68._8_56_ = extraout_var_03;
        auVar24 = auVar68._0_16_;
      }
      else {
        auVar55._8_8_ = 0;
        auVar55._0_8_ = dVar43;
        auVar24 = vsqrtsd_avx(auVar55,auVar55);
      }
      auVar56._0_4_ = (float)auVar24._0_8_;
      auVar56._4_12_ = auVar24._4_12_;
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      _local_118 = vxorps_avx512vl(auVar56,auVar3);
    }
    else {
      auVar54._0_4_ = fVar216 * fVar216;
      fVar41 = local_1b8._4_4_;
      auVar54._4_4_ = fVar41 * fVar41;
      fVar222 = local_1b8._8_4_;
      auVar54._8_4_ = fVar222 * fVar222;
      fVar82 = local_1b8._12_4_;
      auVar54._12_4_ = fVar82 * fVar82;
      auVar24 = vhaddps_avx(auVar54,auVar54);
      auVar24 = vsqrtss_avx(auVar24,auVar24);
      fVar42 = 1.0 / auVar24._0_4_;
      local_1b8._0_4_ = fVar216 * fVar42;
      local_1b8._4_4_ = fVar41 * fVar42;
      local_1b8._8_4_ = fVar222 * fVar42;
      local_1b8._12_4_ = fVar82 * fVar42;
      _local_118 = ZEXT416((uint)(fVar42 * 0.0));
    }
    auVar20 = vmovshdup_avx(local_1b8._0_16_);
    auVar18 = vmovshdup_avx(local_178._0_16_);
    auVar24 = vinsertps_avx(ZEXT416((uint)(fVar221 * -auVar20._0_4_)),
                            ZEXT416((uint)(local_178._0_4_ * -local_118._0_4_)),0x10);
    _local_1e8 = vfmsub231ss_fma(ZEXT416((uint)(auVar18._0_4_ * local_1b8._0_4_)),local_178._0_16_,
                                 auVar20);
    local_218._0_4_ = -local_1e8._0_4_;
    auVar20 = vmaxss_avx(SUB6416(ZEXT464(0xbf800000),0),
                         ZEXT416((uint)(fVar221 * local_118._0_4_ +
                                       local_178._0_4_ * local_1b8._0_4_ +
                                       auVar18._0_4_ * auVar20._0_4_)));
    auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
    dVar43 = acos((double)auVar20._0_4_ * moveScale);
    local_138._0_4_ = (float)dVar43;
    local_128 = cosf((float)dVar43);
    fStack_124 = (float)extraout_XMM0_Db;
    fStack_120 = (float)extraout_XMM0_Dc;
    fStack_11c = (float)extraout_XMM0_Dd;
    auVar69._0_4_ = sinf((float)local_138._0_4_);
    auVar69._4_60_ = extraout_var;
    auVar8._4_4_ = fStack_124;
    auVar8._0_4_ = local_128;
    auVar8._8_4_ = fStack_120;
    auVar8._12_4_ = fStack_11c;
    lVar11 = 8;
    auVar18 = vpermi2ps_avx512vl(_DAT_00337450,local_1b8._0_16_,local_178._0_16_);
    local_128 = 1.0 - local_128;
    auVar122._0_8_ = CONCAT44(extraout_var._0_4_,auVar69._0_4_) ^ 0x8000000080000000;
    auVar122._8_4_ = extraout_var._4_4_ ^ 0x80000000;
    auVar122._12_4_ = extraout_var._8_4_ ^ 0x80000000;
    auVar20 = vinsertps_avx(_local_118,ZEXT416((uint)fVar221),0x10);
    auVar31 = vpermi2ps_avx512vl(_DAT_00337460,auVar69._0_16_,auVar122);
    auVar24 = vfmadd213ps_fma(auVar20,auVar18,auVar24);
    fVar216 = auVar24._0_4_;
    auVar94._0_4_ = fVar216 * fVar216;
    fVar221 = auVar24._4_4_;
    auVar94._4_4_ = fVar221 * fVar221;
    fVar41 = auVar24._8_4_;
    auVar94._8_4_ = fVar41 * fVar41;
    fVar222 = auVar24._12_4_;
    auVar94._12_4_ = fVar222 * fVar222;
    auVar24 = vhaddps_avx(auVar94,auVar94);
    auVar24 = ZEXT416((uint)((float)local_1e8._0_4_ * (float)local_1e8._0_4_ + auVar24._0_4_));
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    fVar42 = 1.0 / auVar24._0_4_;
    fVar82 = fVar42 * (float)local_218._0_4_;
    auVar95._0_4_ = fVar42 * -fVar216;
    auVar95._4_4_ = fVar42 * -fVar221;
    auVar95._8_4_ = fVar42 * -fVar41;
    auVar95._12_4_ = fVar42 * -fVar222;
    fVar216 = local_128 * fVar82;
    auVar107._0_4_ = local_128 * auVar95._0_4_;
    auVar107._4_4_ = local_128 * auVar95._4_4_;
    auVar107._8_4_ = local_128 * auVar95._8_4_;
    auVar107._12_4_ = local_128 * auVar95._12_4_;
    auVar160._4_4_ = auVar95._0_4_;
    auVar160._0_4_ = auVar95._0_4_;
    auVar160._8_4_ = auVar95._0_4_;
    auVar160._12_4_ = auVar95._0_4_;
    auVar24 = vinsertps_avx(auVar8,ZEXT416((uint)(fVar82 * -auVar69._0_4_)),0x10);
    auVar20 = vinsertps_avx(ZEXT416((uint)(auVar69._0_4_ * fVar82)),auVar8,0x10);
    auVar18 = vshufps_avx(auVar95,auVar95,0xe1);
    auVar28 = vfmadd231ps_fma(auVar24,auVar107,auVar160);
    auVar24 = vmovshdup_avx(auVar95);
    auVar123._0_4_ = auVar18._0_4_ * auVar31._0_4_;
    auVar123._4_4_ = auVar18._4_4_ * auVar31._4_4_;
    auVar123._8_4_ = auVar18._8_4_ * auVar31._8_4_;
    auVar123._12_4_ = auVar18._12_4_ * auVar31._12_4_;
    auVar178._4_4_ = fVar82;
    auVar178._0_4_ = fVar82;
    auVar178._8_4_ = fVar82;
    auVar178._12_4_ = fVar82;
    auVar18 = vfmadd231ps_fma(auVar20,auVar107,auVar24);
    auVar31 = vfmadd213ss_fma(ZEXT416((uint)fVar82),ZEXT416((uint)fVar216),auVar8);
    auVar20 = vfmadd213ps_fma(auVar178,auVar107,auVar123);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ * auVar69._0_4_)),ZEXT416((uint)fVar216),
                              auVar95);
    auVar24 = vfmsub231ss_fma(ZEXT416((uint)(auVar95._0_4_ * auVar69._0_4_)),ZEXT416((uint)fVar216),
                              auVar24);
    fVar216 = auVar18._0_4_ * 0.0;
    fVar221 = auVar18._4_4_ * 0.0;
    fVar222 = auVar18._8_4_ * 0.0;
    fVar99 = auVar18._12_4_ * 0.0;
    local_1e8._0_4_ = auVar20._0_4_ * 0.0;
    local_1e8._4_4_ = auVar20._4_4_ * 0.0;
    fStack_1e0 = auVar20._8_4_ * 0.0;
    fStack_1dc = auVar20._12_4_ * 0.0;
    fVar82 = auVar28._0_4_ * 0.0;
    fVar42 = auVar28._4_4_ * 0.0;
    fVar156 = auVar28._8_4_ * 0.0;
    fVar91 = auVar28._12_4_ * 0.0;
    local_f8 = fVar82 + fVar216;
    fStack_f4 = fVar42 + fVar221;
    fStack_f0 = fVar156 + fVar222;
    fStack_ec = fVar91 + fVar99;
    fVar41 = auVar24._0_4_ * 0.0;
    local_128 = (float)local_1e8._0_4_ + auVar28._0_4_ + fVar216;
    fStack_124 = (float)local_1e8._4_4_ + auVar28._4_4_ + fVar221;
    fStack_120 = fStack_1e0 + auVar28._8_4_ + fVar222;
    fStack_11c = fStack_1dc + auVar28._12_4_ + fVar99;
    local_118._4_4_ = auVar20._4_4_ + fStack_f4;
    local_118._0_4_ = auVar20._0_4_ + local_f8;
    fStack_110 = auVar20._8_4_ + fStack_f0;
    fStack_10c = auVar20._12_4_ + fStack_ec;
    fVar222 = auVar27._0_4_ * 0.0;
    fVar221 = auVar31._0_4_ * 0.0;
    fVar216 = fVar41 + fVar222;
    local_1b8._0_16_ = ZEXT416((uint)(fVar41 + auVar27._0_4_ + fVar221));
    local_178._0_16_ = ZEXT416((uint)(auVar31._0_4_ + fVar216));
    do {
      uVar1 = *(undefined4 *)((long)&viewMat + lVar11);
      *(undefined8 *)((long)&local_a4.field_1 + lVar11) = *(undefined8 *)((long)&style + lVar11);
      *(undefined4 *)((long)&local_98 + lVar11) = uVar1;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x38);
    fStack_5c = 1.0;
    local_f8 = (float)local_1e8._0_4_ + local_f8;
    fStack_f4 = (float)local_1e8._4_4_ + fStack_f4;
    fStack_f0 = fStack_1e0 + fStack_f0;
    fStack_ec = fStack_1dc + fStack_ec;
    fVar41 = fVar221 + auVar24._0_4_ + fVar222;
    fVar221 = fVar221 + fVar216;
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call
              ((mat<4,_4,_float,_(glm::qualifier)0> *)&local_98);
    auVar217._8_8_ = 0;
    auVar217._0_8_ = local_40;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = local_50;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = local_30;
    auVar9._4_4_ = fStack_f4;
    auVar9._0_4_ = local_f8;
    auVar9._8_4_ = fStack_f0;
    auVar9._12_4_ = fStack_ec;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = local_58;
    auVar24 = vmulss_avx512f(local_1b8._0_16_,auVar257);
    auVar263._8_8_ = 0;
    auVar263._0_8_ = local_48;
    auVar20 = vmulss_avx512f(ZEXT416((uint)fVar41),auVar263);
    fVar99 = local_1b8._0_4_;
    fVar146 = (float)local_50;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = local_20;
    auVar28 = vmovshdup_avx512vl(auVar259);
    fVar215 = (float)local_40;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = local_38;
    auVar31 = vmulss_avx512f(local_178._0_16_,auVar261);
    fVar93 = local_178._0_4_;
    fVar165 = (float)local_30;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = local_28;
    auVar27 = vmulss_avx512f(ZEXT416((uint)fVar221),auVar273);
    auVar20 = vaddss_avx512f(ZEXT416((uint)(auVar24._0_4_ + auVar20._0_4_ + auVar31._0_4_)),auVar27)
    ;
    auVar24 = vmulss_avx512f(ZEXT416((uint)fVar221),auVar259);
    local_1bc = fVar99 * fVar146 + fVar215 * fVar41 + fVar165 * fVar93 + auVar24._0_4_;
    local_1d0 = auVar20._0_4_;
    auVar57._0_12_ = ZEXT812(0);
    auVar57._12_4_ = 0;
    auVar31 = vmulss_avx512f(auVar257,auVar57);
    auVar27 = vmulss_avx512f(auVar263,auVar57);
    auVar29 = vmulss_avx512f(auVar261,auVar57);
    local_1c0 = fVar146 * 0.0 + fVar215 * 0.0 + fVar165 * 0.0;
    local_c8 = vmovshdup_avx(auVar217);
    auVar208._0_4_ = (float)local_1e8._0_4_ + auVar18._0_4_ + fVar82;
    auVar208._4_4_ = (float)local_1e8._4_4_ + auVar18._4_4_ + fVar42;
    auVar208._8_4_ = fStack_1e0 + auVar18._8_4_ + fVar156;
    auVar208._12_4_ = fStack_1dc + auVar18._12_4_ + fVar91;
    local_b8 = vmovshdup_avx(auVar150);
    local_d8 = vmovshdup_avx(auVar179);
    fVar222 = local_118._0_4_;
    fVar82 = local_118._4_4_;
    fVar42 = local_118._8_4_;
    fVar156 = local_118._12_4_;
    auVar24 = vmulps_avx512vl(auVar9,auVar28);
    auVar204._0_4_ =
         local_128 * local_b8._0_4_ + auVar208._0_4_ * local_c8._0_4_ + fVar222 * local_d8._0_4_ +
         auVar24._0_4_;
    auVar204._4_4_ =
         fStack_124 * local_b8._4_4_ + auVar208._4_4_ * local_c8._4_4_ + fVar82 * local_d8._4_4_ +
         auVar24._4_4_;
    auVar204._8_4_ =
         fStack_120 * local_b8._8_4_ + auVar208._8_4_ * local_c8._8_4_ + fVar42 * local_d8._8_4_ +
         auVar24._8_4_;
    auVar204._12_4_ =
         fStack_11c * local_b8._12_4_ + auVar208._12_4_ * local_c8._12_4_ +
         fVar156 * local_d8._12_4_ + auVar24._12_4_;
    auVar24 = vmovshdup_avx(auVar204);
    auVar18 = vmulss_avx512f(ZEXT416((uint)local_98),auVar204);
    auVar30 = vmulss_avx512f(ZEXT416(uStack_94),auVar24);
    local_1c8 = auVar18._0_4_ + auVar30._0_4_;
    auVar18 = vmulss_avx512f(auVar24,ZEXT416(local_90[3]));
    auVar30 = vmulss_avx512f(auVar204,ZEXT416(local_90[2]));
    local_1c4 = auVar30._0_4_ + auVar18._0_4_;
    local_1cc = auVar204._0_4_ * local_78 + auVar24._0_4_ * local_74;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = local_48;
    auVar24 = vbroadcastss_avx512vl(auVar264);
    auVar30 = vmovshdup_avx512vl(auVar264);
    auVar258._8_8_ = 0;
    auVar258._0_8_ = local_58;
    auVar18 = vbroadcastss_avx512vl(auVar258);
    auVar262._8_8_ = 0;
    auVar262._0_8_ = local_38;
    auVar17 = vbroadcastss_avx512vl(auVar262);
    auVar19 = vmovshdup_avx512vl(auVar262);
    auVar21 = vbroadcastss_avx512vl(auVar273);
    auVar85._0_4_ =
         local_f8 * auVar21._0_4_ +
         auVar17._0_4_ * fVar222 + auVar208._0_4_ * auVar24._0_4_ + local_128 * auVar18._0_4_;
    auVar85._4_4_ =
         fStack_f4 * auVar21._4_4_ +
         auVar17._4_4_ * fVar82 + auVar208._4_4_ * auVar24._4_4_ + fStack_124 * auVar18._4_4_;
    auVar85._8_4_ =
         fStack_f0 * auVar21._8_4_ +
         auVar17._8_4_ * fVar42 + auVar208._8_4_ * auVar24._8_4_ + fStack_120 * auVar18._8_4_;
    auVar85._12_4_ =
         fStack_ec * auVar21._12_4_ +
         auVar17._12_4_ * fVar156 + auVar208._12_4_ * auVar24._12_4_ + fStack_11c * auVar18._12_4_;
    auVar24 = vmovshdup_avx(auVar85);
    auVar18 = vmulss_avx512f(ZEXT416((uint)local_98),auVar85);
    auVar17 = vmulss_avx512f(auVar24,ZEXT416(uStack_94));
    auVar18 = vaddss_avx512f(auVar18,auVar17);
    auVar17 = vmulss_avx512f(auVar20,ZEXT416(local_90[0]));
    auVar18 = vaddss_avx512f(auVar18,auVar17);
    auVar274._8_8_ = 0;
    auVar274._0_8_ = local_28;
    auVar27 = vaddss_avx512f(ZEXT416((uint)(auVar31._0_4_ + auVar27._0_4_ + auVar29._0_4_)),auVar274
                            );
    auVar31 = vmulss_avx512f(auVar27,ZEXT416(local_90[1]));
    _local_1e8 = vaddss_avx512f(auVar18,auVar31);
    auVar18 = vmulss_avx512f(auVar85,ZEXT416(local_90[2]));
    auVar31 = vmulss_avx512f(auVar24,ZEXT416(local_90[3]));
    auVar18 = vaddss_avx512f(auVar18,auVar31);
    auVar31 = vmulss_avx512f(auVar20,ZEXT416(local_90[4]));
    auVar18 = vaddss_avx512f(auVar18,auVar31);
    auVar31 = vmulss_avx512f(auVar27,ZEXT416(local_90[5]));
    auVar29 = vaddss_avx512f(auVar18,auVar31);
    auVar20 = vmulss_avx512f(auVar20,ZEXT416(uStack_70));
    auVar18 = vmulss_avx512f(auVar27,ZEXT416(local_6c));
    fVar216 = auVar85._0_4_ * local_78 + auVar24._0_4_ * local_74 + auVar20._0_4_ + auVar18._0_4_;
    auVar17 = vmovshdup_avx512vl(auVar258);
    auVar24 = vmulps_avx512vl(auVar208,auVar30);
    auVar199._0_4_ = auVar17._0_4_ * local_128;
    auVar199._4_4_ = auVar17._4_4_ * fStack_124;
    auVar199._8_4_ = auVar17._8_4_ * fStack_120;
    auVar199._12_4_ = auVar17._12_4_ * fStack_11c;
    local_138 = ZEXT416((uint)fVar216);
    auVar24 = vaddps_avx512vl(auVar199,auVar24);
    auVar20 = vmulps_avx512vl(_local_118,auVar19);
    auVar24 = vaddps_avx512vl(auVar24,auVar20);
    auVar31 = vmulss_avx512f(ZEXT416((uint)fVar221),auVar28);
    auVar20 = vmovshdup_avx512vl(auVar274);
    local_e8 = vmulss_avx512f(ZEXT416((uint)fVar221),auVar20);
    auVar20 = vmulps_avx512vl(auVar9,auVar20);
    auVar20 = vaddps_avx512vl(auVar24,auVar20);
    auVar24 = vmovshdup_avx(auVar20);
    auVar18 = vmulss_avx512f(ZEXT416((uint)local_98),auVar20);
    auVar28 = vmulss_avx512f(auVar24,ZEXT416(uStack_94));
    auVar18 = vaddss_avx512f(auVar18,auVar28);
    auVar28 = vmulss_avx512f(auVar20,ZEXT416(local_90[2]));
    local_1d4 = auVar18._0_4_;
    auVar18 = vmulss_avx512f(auVar24,ZEXT416(local_90[3]));
    auVar21 = vaddss_avx512f(auVar28,auVar18);
    auVar18 = vmulss_avx512f(auVar20,ZEXT416((uint)local_78));
    auVar22 = vaddss_avx512f(auVar18,ZEXT416((uint)(auVar24._0_4_ * local_74)));
    auVar260._8_8_ = 0;
    auVar260._0_8_ = local_20;
    auVar24 = vbroadcastss_avx512vl(auVar260);
    auVar58._0_4_ =
         local_f8 * auVar24._0_4_ +
         local_128 * fVar146 + auVar208._0_4_ * fVar215 + fVar222 * fVar165;
    auVar58._4_4_ =
         fStack_f4 * auVar24._4_4_ +
         fStack_124 * fVar146 + auVar208._4_4_ * fVar215 + fVar82 * fVar165;
    auVar58._8_4_ =
         fStack_f0 * auVar24._8_4_ +
         fStack_120 * fVar146 + auVar208._8_4_ * fVar215 + fVar42 * fVar165;
    auVar58._12_4_ =
         fStack_ec * auVar24._12_4_ +
         fStack_11c * fVar146 + auVar208._12_4_ * fVar215 + fVar156 * fVar165;
    auVar18 = vmulss_avx512f(ZEXT416((uint)local_98),auVar58);
    auVar23 = vaddss_avx512f(auVar260,ZEXT416((uint)local_1c0));
    auVar24 = vmovshdup_avx(auVar58);
    auVar28 = vmulss_avx512f(ZEXT416(uStack_94),auVar24);
    auVar25 = vmulss_avx512f(ZEXT416((uint)local_1bc),ZEXT416(local_90[0]));
    auVar26 = vmulss_avx512f(ZEXT416((uint)local_1bc),ZEXT416(uStack_70));
    auVar12 = vmulss_avx512f(auVar23,ZEXT416(local_90[1]));
    auVar13 = vmulss_avx512f(auVar23,ZEXT416(local_6c));
    auVar25 = vaddss_avx512f(auVar12,ZEXT416((uint)(auVar25._0_4_ + auVar28._0_4_ + auVar18._0_4_)))
    ;
    auVar18 = vmulss_avx512f(auVar58,ZEXT416(local_90[2]));
    auVar28 = vmulss_avx512f(auVar24,ZEXT416(local_90[3]));
    auVar24 = vaddss_avx512f(ZEXT416((uint)(auVar58._0_4_ * local_78 + auVar24._0_4_ * local_74 +
                                           auVar26._0_4_)),auVar13);
    auVar26 = vmulss_avx512f(ZEXT416((uint)local_1bc),ZEXT416(local_90[4]));
    auVar12 = vbroadcastss_avx512vl(auVar24);
    auVar24 = vmulss_avx512f(auVar23,ZEXT416(local_90[5]));
    fVar221 = (float)uStack_68;
    auVar151._0_4_ = auVar20._0_4_ * fVar221;
    fVar222 = (float)((ulong)uStack_68 >> 0x20);
    auVar151._4_4_ = auVar20._4_4_ * fVar222;
    auVar151._8_4_ = auVar20._8_4_ * 0.0;
    auVar151._12_4_ = auVar20._12_4_ * 0.0;
    auVar86._0_4_ = auVar85._0_4_ * fVar221;
    auVar86._4_4_ = auVar85._4_4_ * fVar222;
    auVar86._8_4_ = auVar85._8_4_ * 0.0;
    auVar86._12_4_ = auVar85._12_4_ * 0.0;
    auVar59._0_4_ = auVar58._0_4_ * fVar221;
    auVar59._4_4_ = auVar58._4_4_ * fVar222;
    auVar59._8_4_ = auVar58._8_4_ * 0.0;
    auVar59._12_4_ = auVar58._12_4_ * 0.0;
    auVar26 = vaddss_avx512f(ZEXT416((uint)(auVar26._0_4_ + auVar28._0_4_ + auVar18._0_4_)),auVar24)
    ;
    auVar139._0_4_ = auVar204._0_4_ * fVar221;
    auVar139._4_4_ = auVar204._4_4_ * fVar222;
    auVar139._8_4_ = auVar204._8_4_ * 0.0;
    auVar139._12_4_ = auVar204._12_4_ * 0.0;
    auVar34._16_48_ = auVar38;
    auVar34._0_16_ = ZEXT816(0);
    auVar33._4_60_ = auVar34._4_60_;
    auVar33._0_4_ = fVar41;
    auVar13 = vmulps_avx512vl(auVar33._0_16_,local_c8);
    auVar24 = vhaddps_avx(auVar86,auVar86);
    auVar20 = vhaddps_avx(auVar59,auVar59);
    auVar18 = vhaddps_avx(auVar151,auVar151);
    auVar28 = vhaddps_avx(auVar139,auVar139);
    auVar19 = vmulps_avx512vl(ZEXT416((uint)fVar93),auVar19);
    auVar108._0_4_ =
         fVar99 * local_b8._0_4_ + auVar13._0_4_ + fVar93 * local_d8._0_4_ + auVar31._0_4_;
    auVar108._4_4_ =
         local_b8._4_4_ * 0.0 + auVar13._4_4_ + local_d8._4_4_ * 0.0 + (float)(local_20 >> 0x20);
    auVar108._8_4_ = local_b8._8_4_ * 0.0 + auVar13._8_4_ + local_d8._8_4_ * 0.0 + 0.0;
    auVar108._12_4_ = local_b8._12_4_ * 0.0 + auVar13._12_4_ + local_d8._12_4_ * 0.0 + 0.0;
    auVar13 = vmulss_avx512f(auVar108,ZEXT416(local_90[0]));
    auVar31 = vmovshdup_avx(auVar108);
    auVar14 = vmulss_avx512f(auVar31,ZEXT416(local_90[1]));
    auVar15 = vmulss_avx512f(auVar31,ZEXT416(local_90[5]));
    auVar16 = vmulss_avx512f(auVar31,ZEXT416(local_6c));
    fVar221 = auVar14._0_4_ + auVar13._0_4_ + local_1c8;
    auVar31 = vmulss_avx512f(auVar108,ZEXT416(local_90[4]));
    auVar180._4_4_ = fVar221;
    auVar180._0_4_ = fVar221;
    auVar180._8_4_ = fVar221;
    auVar180._12_4_ = fVar221;
    fVar41 = auVar15._0_4_ + auVar31._0_4_ + local_1c4;
    auVar13 = vmulss_avx512f(auVar108,ZEXT416(uStack_70));
    auVar124._4_4_ = fVar41;
    auVar124._0_4_ = fVar41;
    auVar124._8_4_ = fVar41;
    auVar124._12_4_ = fVar41;
    auVar200._4_4_ = fStack_5c;
    auVar200._0_4_ = local_60;
    auVar200._8_8_ = 0;
    auVar14 = vaddss_avx512f(auVar24,ZEXT416((uint)(local_60 * local_1d0)));
    auVar24 = vmulps_avx512vl(auVar33._0_16_,auVar30);
    auVar96._0_4_ = auVar17._0_4_ * fVar99 + auVar24._0_4_ + auVar19._0_4_ + (float)local_e8._0_4_;
    auVar96._4_4_ = auVar17._4_4_ * 0.0 + auVar24._4_4_ + auVar19._4_4_ + (float)(local_28 >> 0x20);
    auVar96._8_4_ = auVar17._8_4_ * 0.0 + auVar24._8_4_ + auVar19._8_4_ + 0.0;
    auVar96._12_4_ = auVar17._12_4_ * 0.0 + auVar24._12_4_ + auVar19._12_4_ + 0.0;
    auVar30 = vmulss_avx512f(auVar96,ZEXT416(local_90[0]));
    auVar24 = vmovshdup_avx(auVar96);
    auVar17 = vmulss_avx512f(auVar96,ZEXT416(uStack_70));
    auVar218._0_4_ = local_60 * auVar96._0_4_;
    auVar218._4_4_ = fStack_5c * auVar96._4_4_;
    auVar218._8_4_ = auVar96._8_4_ * 0.0;
    auVar218._12_4_ = auVar96._12_4_ * 0.0;
    auVar19 = vbroadcastss_avx512vl(ZEXT416((uint)fVar216));
    auVar15 = vmulss_avx512f(auVar24,ZEXT416(local_90[1]));
    auVar31 = vmovshdup_avx(auVar218);
    fVar216 = auVar31._0_4_ + auVar218._0_4_ + auVar18._0_4_;
    auVar152._4_4_ = fVar216;
    auVar152._0_4_ = fVar216;
    auVar152._8_4_ = fVar216;
    auVar152._12_4_ = fVar216;
    fVar222 = auVar30._0_4_ + local_1d4 + auVar15._0_4_;
    auVar18 = vmulss_avx512f(auVar96,ZEXT416(local_90[4]));
    auVar18 = vaddss_avx512f(auVar21,auVar18);
    auVar77._0_4_ = local_60 * auVar108._0_4_;
    auVar77._4_4_ = fStack_5c * auVar108._4_4_;
    auVar77._8_4_ = auVar108._8_4_ * 0.0;
    auVar77._12_4_ = auVar108._12_4_ * 0.0;
    auVar31 = vmulss_avx512f(auVar24,ZEXT416(local_90[5]));
    auVar30 = vmulss_avx512f(auVar24,ZEXT416(local_6c));
    fVar82 = auVar18._0_4_ + auVar31._0_4_;
    auVar24 = vmovshdup_avx(auVar200);
    auVar201._8_8_ = 0;
    auVar201._0_8_ = DAT_005fc694;
    fVar42 = auVar17._0_4_ + auVar22._0_4_ + auVar30._0_4_;
    auVar18 = vmovshdup_avx(auVar77);
    auVar31 = vmulss_avx512f(auVar23,auVar24);
    auVar109._8_8_ = 0;
    auVar109._0_8_ = DAT_005fc6a4;
    fVar156 = auVar28._0_4_ + auVar77._0_4_ + auVar18._0_4_;
    auVar209._4_4_ = fVar42;
    auVar209._0_4_ = fVar42;
    auVar209._8_4_ = fVar42;
    auVar209._12_4_ = fVar42;
    auVar87._4_4_ = fVar82;
    auVar87._0_4_ = fVar82;
    auVar87._8_4_ = fVar82;
    auVar87._12_4_ = fVar82;
    auVar24 = vaddss_avx512f(auVar14,ZEXT416((uint)(auVar27._0_4_ * auVar24._0_4_)));
    fVar42 = auVar20._0_4_ + local_1bc * local_60 + auVar31._0_4_;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = DAT_005fc6b4;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = _DAT_005fc68c;
    auVar78._4_4_ = fVar156;
    auVar78._0_4_ = fVar156;
    auVar78._8_4_ = fVar156;
    auVar78._12_4_ = fVar156;
    auVar24 = vbroadcastss_avx512vl(auVar24);
    auVar161._4_4_ = fVar42;
    auVar161._0_4_ = fVar42;
    auVar161._8_4_ = fVar42;
    auVar161._12_4_ = fVar42;
    fVar91 = viewMat._16_4_;
    auVar219._0_4_ = fVar91 * fVar216;
    fVar99 = viewMat._20_4_;
    auVar219._4_4_ = fVar99 * fVar216;
    auVar219._8_4_ = fVar216 * 0.0;
    auVar219._12_4_ = fVar216 * 0.0;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = _DAT_005fc69c;
    auVar20 = vmulps_avx512vl(auVar152,auVar269);
    auVar18 = vmulps_avx512vl(auVar209,auVar201);
    auVar28 = vmulps_avx512vl(auVar209,auVar269);
    auVar271._8_8_ = 0;
    auVar271._0_8_ = viewMat;
    auVar31 = vmulps_avx512vl(auVar24,auVar271);
    auVar27 = vmulps_avx512vl(auVar161,auVar109);
    auVar30 = vmulps_avx512vl(auVar19,auVar271);
    auVar267._8_8_ = 0;
    auVar267._0_8_ = DAT_005fc6ac;
    auVar17 = vmulps_avx512vl(auVar161,auVar267);
    auVar31 = vaddps_avx512vl(auVar31,auVar219);
    fVar216 = viewMat._48_4_;
    fVar42 = viewMat._52_4_;
    auVar19 = vmulps_avx512vl(auVar19,auVar60);
    auVar18 = vaddps_avx512vl(auVar30,auVar18);
    auVar30 = vmulps_avx512vl(auVar12,auVar109);
    auVar265._8_8_ = 0;
    auVar265._0_8_ = DAT_005fc6bc;
    auVar21 = vmulps_avx512vl(auVar78,auVar265);
    auVar22 = vmulps_avx512vl(auVar12,auVar267);
    auVar31 = vaddps_avx512vl(auVar31,auVar27);
    auVar28 = vaddps_avx512vl(auVar19,auVar28);
    auVar18 = vaddps_avx512vl(auVar18,auVar30);
    auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(auVar13._0_4_ + local_1cc + auVar16._0_4_)));
    auVar30 = vmulps_avx512vl(auVar27,auVar97);
    auVar27 = vmulps_avx512vl(auVar27,auVar265);
    auVar24 = vmulps_avx512vl(auVar24,auVar60);
    auVar28 = vaddps_avx512vl(auVar28,auVar22);
    auVar18 = vaddps_avx512vl(auVar18,auVar30);
    auVar28 = vaddps_avx512vl(auVar28,auVar27);
    auVar35 = vbroadcasti64x4_avx512f(_DAT_00336d40);
    auVar79._0_4_ = auVar17._0_4_ + auVar24._0_4_ + auVar20._0_4_ + auVar21._0_4_;
    auVar79._4_4_ = auVar17._4_4_ + auVar24._4_4_ + auVar20._4_4_ + auVar21._4_4_;
    auVar79._8_4_ = auVar17._8_4_ + auVar24._8_4_ + auVar20._8_4_ + auVar21._8_4_;
    auVar79._12_4_ = auVar17._12_4_ + auVar24._12_4_ + auVar20._12_4_ + auVar21._12_4_;
    auVar36 = vinsertf32x4_avx512f(ZEXT1664(auVar18),auVar28,1);
    auVar37 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar31._12_4_ + fVar156 * 0.0,
                                            CONCAT48(auVar31._8_4_ + fVar156 * 0.0,
                                                     CONCAT44(auVar31._4_4_ + fVar156 * fVar42,
                                                              auVar31._0_4_ + fVar156 * fVar216)))),
                         auVar79,1);
    auVar140._4_4_ = local_1e8._0_4_;
    auVar140._0_4_ = local_1e8._0_4_;
    auVar140._8_4_ = local_1e8._0_4_;
    auVar140._12_4_ = local_1e8._0_4_;
    auVar35 = vpermi2pd_avx512f(auVar35,auVar36,auVar37);
    auVar153._4_4_ = fVar222;
    auVar153._0_4_ = fVar222;
    auVar153._8_4_ = fVar222;
    auVar153._12_4_ = fVar222;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = _DAT_005fc69c;
    auVar24 = vmulps_avx512vl(auVar153,auVar270);
    auVar272._8_8_ = 0;
    auVar272._0_8_ = viewMat;
    auVar20 = vmulps_avx512vl(auVar140,auVar272);
    auVar18 = vbroadcastss_avx512vl(auVar25);
    auVar268._8_8_ = 0;
    auVar268._0_8_ = DAT_005fc6ac;
    auVar28 = vmulps_avx512vl(auVar18,auVar268);
    auVar266._8_8_ = 0;
    auVar266._0_8_ = DAT_005fc6bc;
    auVar31 = vmulps_avx512vl(auVar180,auVar266);
    local_208 = auVar29._0_4_;
    auVar220._4_4_ = local_208;
    auVar220._0_4_ = local_208;
    auVar220._8_4_ = local_208;
    auVar220._12_4_ = local_208;
    auVar141._0_4_ =
         auVar31._0_4_ + (float)local_1e8._0_4_ * viewMat._8_4_ + auVar24._0_4_ + auVar28._0_4_;
    auVar141._4_4_ =
         auVar31._4_4_ + (float)local_1e8._0_4_ * viewMat._12_4_ + auVar24._4_4_ + auVar28._4_4_;
    auVar141._8_4_ = auVar31._8_4_ + (float)local_1e8._0_4_ * 0.0 + auVar24._8_4_ + auVar28._8_4_;
    auVar141._12_4_ =
         auVar31._12_4_ + (float)local_1e8._0_4_ * 0.0 + auVar24._12_4_ + auVar28._12_4_;
    auVar24 = vbroadcastss_avx512vl(auVar26);
    auVar28 = vmulps_avx512vl(auVar87,auVar270);
    auVar36 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(fVar221 * 0.0 +
                                            auVar18._12_4_ * 0.0 + fVar222 * 0.0 + auVar20._12_4_,
                                            CONCAT48(fVar221 * 0.0 +
                                                     auVar18._8_4_ * 0.0 +
                                                     fVar222 * 0.0 + auVar20._8_4_,
                                                     CONCAT44(fVar221 * fVar42 +
                                                              auVar18._4_4_ * viewMat._36_4_ +
                                                              fVar99 * fVar222 + auVar20._4_4_,
                                                              fVar221 * fVar216 +
                                                              auVar18._0_4_ * viewMat._32_4_ +
                                                              fVar91 * fVar222 + auVar20._0_4_)))),
                         auVar141,1);
    auVar20 = vmulps_avx512vl(auVar220,auVar272);
    auVar18 = vmulps_avx512vl(auVar24,auVar268);
    auVar31 = vmulps_avx512vl(auVar124,auVar266);
    auVar61._0_4_ = local_208 * viewMat._8_4_ + auVar28._0_4_ + auVar18._0_4_ + auVar31._0_4_;
    auVar61._4_4_ = local_208 * viewMat._12_4_ + auVar28._4_4_ + auVar18._4_4_ + auVar31._4_4_;
    auVar61._8_4_ = local_208 * 0.0 + auVar28._8_4_ + auVar18._8_4_ + auVar31._8_4_;
    auVar61._12_4_ = local_208 * 0.0 + auVar28._12_4_ + auVar18._12_4_ + auVar31._12_4_;
    auVar37 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar20._12_4_ + fVar82 * 0.0 + auVar24._12_4_ * 0.0 +
                                            fVar41 * 0.0,
                                            CONCAT48(auVar20._8_4_ + fVar82 * 0.0 +
                                                     auVar24._8_4_ * 0.0 + fVar41 * 0.0,
                                                     CONCAT44(auVar20._4_4_ + fVar99 * fVar82 +
                                                              auVar24._4_4_ * viewMat._36_4_ +
                                                              fVar41 * fVar42,
                                                              auVar20._0_4_ + fVar91 * fVar82 +
                                                              auVar24._0_4_ * viewMat._32_4_ +
                                                              fVar41 * fVar216)))),auVar61,1);
    auVar32 = vpermi2pd_avx512vl(_DAT_00336d60,auVar36._0_32_,auVar37._0_32_);
    _viewMat = vinsertf64x4_avx512f(auVar35,auVar32,0);
    goto switchD_001f7428_caseD_2;
  case 5:
    break;
  }
  _local_1e8 = ZEXT816(0) << 0x40;
  local_178._0_4_ = (float)local_1b8._0_4_ - (float)local_178._0_4_;
  local_1b8._8_8_ = 0;
  local_1b8._0_8_ = viewMat;
  local_228._8_8_ = 0;
  local_228._0_8_ = DAT_005fc6a4;
  fVar41 = (float)(((double)(float)local_178._0_4_ + (double)(float)local_178._0_4_) * moveScale);
  dVar43 = ((double)(fVar221 - fVar216) + (double)(fVar221 - fVar216)) * moveScale;
  local_178._4_4_ = (int)((ulong)dVar43 >> 0x20);
  local_178._0_4_ = (float)dVar43;
  local_178._8_8_ = 0;
  local_178 = CONCAT4816(auVar10,local_178._0_16_);
  switch(upDir) {
  case 0:
    auVar24 = SUB6416(ZEXT464(0x3f800000),0);
    break;
  case 1:
    auVar24 = ZEXT816(0x3f80000000000000);
    break;
  case 2:
    _local_1e8 = SUB6416(ZEXT464(0x3f800000),0);
  default:
switchD_001f8053_default:
    auVar24 = ZEXT816(0);
    break;
  case 3:
    auVar24 = SUB6416(ZEXT464(0xbf800000),0);
    break;
  case 4:
    auVar24 = ZEXT816(0xbf80000000000000);
    break;
  case 5:
    _local_1e8 = SUB6416(ZEXT464(0xbf800000),0);
    goto switchD_001f8053_default;
  }
  auVar20 = vmovshdup_avx(auVar24);
  local_138._0_4_ = fVar41;
  auVar28 = vfmadd213ss_fma(ZEXT416((uint)DAT_005fc68c),auVar24,
                            ZEXT416((uint)(DAT_005fc69c * auVar20._0_4_)));
  local_218._4_4_ = viewMat._20_4_ * auVar20._4_4_;
  local_218._0_4_ = viewMat._16_4_ * auVar20._0_4_;
  fStack_210 = auVar20._8_4_ * 0.0;
  fStack_20c = auVar20._12_4_ * 0.0;
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)(float)DAT_005fc6ac),_local_1e8,auVar28);
  local_118._0_4_ = auVar20._0_4_;
  local_128 = cosf(fVar41);
  fStack_124 = extraout_XMM0_Db_00;
  fStack_120 = extraout_XMM0_Dc_00;
  fStack_11c = extraout_XMM0_Dd_00;
  auVar37._0_4_ = sinf((float)local_138._0_4_);
  auVar37._4_60_ = extraout_var_00;
  local_208 = auVar24._0_4_;
  auVar24._4_4_ = local_208;
  auVar24._0_4_ = local_208;
  auVar24._8_4_ = local_208;
  auVar24._12_4_ = local_208;
  auVar28._4_4_ = fStack_124;
  auVar28._0_4_ = local_128;
  auVar28._8_4_ = fStack_120;
  auVar28._12_4_ = fStack_11c;
  auVar17 = vxorps_avx512vl(auVar18,auVar18);
  auVar24 = vfmadd132ps_fma(auVar24,_local_218,local_1b8._0_16_);
  auVar23._4_4_ = local_1e8._0_4_;
  auVar23._0_4_ = local_1e8._0_4_;
  auVar23._8_4_ = local_1e8._0_4_;
  auVar23._12_4_ = local_1e8._0_4_;
  auVar24 = vfmadd132ps_fma(auVar23,auVar24,local_228);
  fVar42 = 1.0 - local_128;
  auVar12._8_4_ = 0x80000000;
  auVar12._0_8_ = 0x8000000080000000;
  auVar12._12_4_ = 0x80000000;
  auVar18 = vbroadcastss_avx512vl(auVar28);
  auVar19 = vmulss_avx512f(ZEXT416((uint)_DAT_005fc690),auVar17);
  auVar20 = vmulss_avx512f(ZEXT416(_DAT_005fc6a0),auVar17);
  auVar21 = vmulss_avx512f(ZEXT416(DAT_005fc6ac._4_4_),auVar17);
  auVar22 = vbroadcastss_avx512vl(auVar20);
  auVar31 = vinsertps_avx512f(auVar22,ZEXT416(_DAT_005fc6a0),0x10);
  fVar216 = auVar24._0_4_;
  auVar20._0_4_ = fVar216 * fVar216;
  fVar221 = auVar24._4_4_;
  auVar20._4_4_ = fVar221 * fVar221;
  fVar41 = auVar24._8_4_;
  auVar20._8_4_ = fVar41 * fVar41;
  fVar222 = auVar24._12_4_;
  auVar20._12_4_ = fVar222 * fVar222;
  auVar191._0_8_ = CONCAT44(extraout_var_00._0_4_,auVar37._0_4_) ^ 0x8000000080000000;
  auVar191._8_4_ = extraout_var_00._4_4_ ^ 0x80000000;
  auVar191._12_4_ = extraout_var_00._8_4_ ^ 0x80000000;
  auVar24 = vhaddps_avx(auVar20,auVar20);
  auVar23 = vmulss_avx512f(ZEXT416((uint)DAT_005fc6bc._4_4_),auVar17);
  auVar24 = ZEXT416((uint)((float)local_118._0_4_ * (float)local_118._0_4_ + auVar24._0_4_));
  auVar20 = vsqrtss_avx(auVar24,auVar24);
  auVar24 = vinsertps_avx(auVar37._0_16_,auVar191,0x10);
  fVar156 = 1.0 / auVar20._0_4_;
  fVar82 = (float)local_118._0_4_ * fVar156;
  auVar202._0_4_ = fVar216 * fVar156;
  auVar202._4_4_ = fVar221 * fVar156;
  auVar202._8_4_ = fVar41 * fVar156;
  auVar202._12_4_ = fVar222 * fVar156;
  auVar205._4_4_ = fVar82;
  auVar205._0_4_ = fVar82;
  auVar205._8_4_ = fVar82;
  auVar205._12_4_ = fVar82;
  fVar216 = fVar42 * fVar82;
  auVar163._0_4_ = fVar42 * auVar202._0_4_;
  auVar163._4_4_ = fVar42 * auVar202._4_4_;
  auVar163._8_4_ = fVar42 * auVar202._8_4_;
  auVar163._12_4_ = fVar42 * auVar202._12_4_;
  auVar192._0_4_ = fVar82 * auVar24._0_4_;
  auVar192._4_4_ = fVar82 * auVar24._4_4_;
  auVar192._8_4_ = fVar82 * auVar24._8_4_;
  auVar192._12_4_ = fVar82 * auVar24._12_4_;
  auVar20 = vshufps_avx(auVar202,auVar202,0xe1);
  auVar24 = vshufps_avx(auVar24,auVar24,0xe1);
  auVar25._0_4_ = auVar20._0_4_ * auVar24._0_4_;
  auVar25._4_4_ = auVar20._4_4_ * auVar24._4_4_;
  auVar25._8_4_ = auVar20._8_4_ * auVar24._8_4_;
  auVar25._12_4_ = auVar20._12_4_ * auVar24._12_4_;
  auVar27._0_4_ = auVar202._0_4_ * auVar24._0_4_;
  auVar27._4_4_ = auVar202._4_4_ * auVar24._4_4_;
  auVar27._8_4_ = auVar202._8_4_ * auVar24._8_4_;
  auVar27._12_4_ = auVar202._12_4_ * auVar24._12_4_;
  auVar30 = vfmadd213ss_fma(ZEXT416((uint)fVar82),ZEXT416((uint)fVar216),auVar28);
  auVar24 = vfmadd231ps_avx512vl(auVar18,auVar163,auVar202);
  auVar203._4_4_ = fVar216;
  auVar203._0_4_ = fVar216;
  auVar203._8_4_ = fVar216;
  auVar203._12_4_ = fVar216;
  auVar29 = vfmadd231ps_fma(auVar192,auVar163,auVar20);
  auVar18 = vfmadd231ps_fma(auVar25,auVar163,auVar205);
  auVar27 = vfmadd213ps_fma(auVar203,auVar20,auVar27);
  auVar25 = vmulps_avx512vl(auVar24,ZEXT416(0) << 0x20);
  auVar206._0_4_ = auVar29._0_4_ * 0.0;
  auVar206._4_4_ = auVar29._4_4_ * 0.0;
  auVar206._8_4_ = auVar29._8_4_ * 0.0;
  auVar206._12_4_ = auVar29._12_4_ * 0.0;
  auVar14._0_4_ = auVar18._0_4_ * 0.0;
  auVar14._4_4_ = auVar18._4_4_ * 0.0;
  auVar14._8_4_ = auVar18._8_4_ * 0.0;
  auVar14._12_4_ = auVar18._12_4_ * 0.0;
  auVar193._0_4_ = auVar27._0_4_ * 0.0;
  auVar193._4_4_ = auVar27._4_4_ * 0.0;
  auVar193._8_4_ = auVar27._8_4_ * 0.0;
  auVar193._12_4_ = auVar27._12_4_ * 0.0;
  auVar26 = vaddps_avx512vl(auVar24,auVar206);
  fVar216 = auVar25._0_4_ + auVar206._0_4_;
  fVar221 = auVar25._4_4_ + auVar206._4_4_;
  fVar41 = auVar25._8_4_ + auVar206._8_4_;
  fVar222 = auVar25._12_4_ + auVar206._12_4_;
  auVar24 = vblendps_avx(auVar14,auVar18,2);
  auVar20 = vblendps_avx(auVar18,auVar14,2);
  auVar28 = vshufps_avx(auVar193,auVar193,0xe1);
  auVar18 = vhaddps_avx(auVar193,auVar193);
  auVar164._0_4_ = auVar29._0_4_ + auVar25._0_4_ + auVar14._0_4_;
  auVar164._4_4_ = auVar29._4_4_ + auVar25._4_4_ + auVar14._4_4_;
  auVar164._8_4_ = auVar29._8_4_ + auVar25._8_4_ + auVar14._8_4_;
  auVar164._12_4_ = auVar29._12_4_ + auVar25._12_4_ + auVar14._12_4_;
  auVar185._0_4_ = auVar26._0_4_ + auVar14._0_4_;
  auVar185._4_4_ = auVar26._4_4_ + auVar14._4_4_;
  auVar185._8_4_ = auVar26._8_4_ + auVar14._8_4_;
  auVar185._12_4_ = auVar26._12_4_ + auVar14._12_4_;
  auVar207._0_4_ = auVar24._0_4_ + fVar216;
  auVar207._4_4_ = auVar24._4_4_ + fVar221;
  auVar207._8_4_ = auVar24._8_4_ + fVar41;
  auVar207._12_4_ = auVar24._12_4_ + fVar222;
  auVar26._0_4_ = fVar216 + auVar20._0_4_;
  auVar26._4_4_ = fVar221 + auVar20._4_4_;
  auVar26._8_4_ = fVar41 + auVar20._8_4_;
  auVar26._12_4_ = fVar222 + auVar20._12_4_;
  auVar29._0_4_ = auVar27._0_4_ + auVar28._0_4_;
  auVar29._4_4_ = auVar27._4_4_ + auVar28._4_4_;
  auVar29._8_4_ = auVar27._8_4_ + auVar28._8_4_;
  auVar29._12_4_ = auVar27._12_4_ + auVar28._12_4_;
  auVar24 = vmulss_avx512f(auVar30,auVar17);
  auVar20 = vbroadcastss_avx512vl(auVar24);
  fVar216 = auVar18._0_4_;
  auVar24 = vinsertps_avx512f(auVar20,auVar30,0x10);
  auVar210._4_4_ = DAT_005fc68c;
  auVar210._0_4_ = DAT_005fc68c;
  auVar210._8_4_ = DAT_005fc68c;
  auVar210._12_4_ = DAT_005fc68c;
  auVar27 = vaddps_avx512vl(auVar20,auVar29);
  auVar194._0_4_ = fVar216 + auVar24._0_4_;
  auVar194._4_4_ = fVar216 + auVar24._4_4_;
  auVar194._8_4_ = fVar216 + auVar24._8_4_;
  auVar194._12_4_ = fVar216 + auVar24._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = viewMat;
  auVar24 = vshufps_avx(auVar27,auVar27,0xe1);
  auVar20 = vmulps_avx512vl(auVar17,auVar164);
  auVar18 = vmulps_avx512vl(auVar17,auVar185);
  auVar28 = vmulps_avx512vl(auVar210,auVar24);
  auVar20 = vshufps_avx512vl(auVar20,auVar20,0xe1);
  auVar20 = vaddps_avx512vl(auVar20,auVar18);
  auVar18 = vaddps_avx512vl(auVar28,auVar20);
  auVar28 = vbroadcastss_avx512vl(auVar19);
  auVar20 = vinsertps_avx512f(auVar28,ZEXT416((uint)_DAT_005fc690),0x10);
  auVar29 = vaddps_avx512vl(auVar28,auVar18);
  auVar18 = vmulps_avx512vl(auVar17,auVar207);
  auVar15._0_4_ = (float)viewMat * auVar26._0_4_;
  auVar15._4_4_ = viewMat._4_4_ * auVar26._4_4_;
  auVar15._8_4_ = auVar26._8_4_ * 0.0;
  auVar15._12_4_ = auVar26._12_4_ * 0.0;
  auVar18 = vshufps_avx512vl(auVar18,auVar18,0xe1);
  auVar18 = vaddps_avx512vl(auVar18,auVar15);
  auVar28 = vshufps_avx512vl(auVar194,auVar194,0xe1);
  auVar30 = vmulps_avx512vl(auVar210,auVar28);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = DAT_005fc694;
  auVar155._0_4_ = auVar20._0_4_ + auVar30._0_4_ + auVar18._0_4_;
  auVar155._4_4_ = auVar20._4_4_ + auVar30._4_4_ + auVar18._4_4_;
  auVar155._8_4_ = auVar20._8_4_ + auVar30._8_4_ + auVar18._8_4_;
  auVar155._12_4_ = auVar20._12_4_ + auVar30._12_4_ + auVar18._12_4_;
  auVar16._4_4_ = DAT_005fc69c;
  auVar16._0_4_ = DAT_005fc69c;
  auVar16._8_4_ = DAT_005fc69c;
  auVar16._12_4_ = DAT_005fc69c;
  auVar20 = vmulps_avx512vl(auVar211,auVar164);
  auVar18 = vmulps_avx512vl(auVar211,auVar185);
  auVar20 = vshufps_avx512vl(auVar20,auVar20,0xe1);
  auVar30 = vmulps_avx512vl(auVar16,auVar24);
  auVar20 = vaddps_avx512vl(auVar20,auVar18);
  auVar18 = vmulps_avx512vl(auVar16,auVar28);
  auVar20 = vaddps_avx512vl(auVar30,auVar20);
  auVar28 = vmulps_avx512vl(auVar211,auVar207);
  auVar212._0_4_ = viewMat._16_4_ * auVar26._0_4_;
  auVar212._4_4_ = viewMat._20_4_ * auVar26._4_4_;
  auVar212._8_4_ = auVar26._8_4_ * 0.0;
  auVar212._12_4_ = auVar26._12_4_ * 0.0;
  auVar28 = vshufps_avx512vl(auVar28,auVar28,0xe1);
  auVar30 = vaddps_avx512vl(auVar22,auVar20);
  auVar20 = vaddps_avx512vl(auVar28,auVar212);
  auVar255._8_8_ = 0;
  auVar255._0_8_ = DAT_005fc6a4;
  auVar28 = vmulps_avx512vl(auVar255,auVar26);
  fVar216 = viewMat._48_4_;
  auVar22._0_4_ = fVar216 * auVar26._0_4_;
  fVar221 = viewMat._52_4_;
  auVar22._4_4_ = fVar221 * auVar26._4_4_;
  auVar22._8_4_ = auVar26._8_4_ * 0.0;
  auVar22._12_4_ = auVar26._12_4_ * 0.0;
  auVar13._0_4_ = auVar31._0_4_ + auVar20._0_4_ + auVar18._0_4_;
  auVar13._4_4_ = auVar31._4_4_ + auVar20._4_4_ + auVar18._4_4_;
  auVar13._8_4_ = auVar31._8_4_ + auVar20._8_4_ + auVar18._8_4_;
  auVar13._12_4_ = auVar31._12_4_ + auVar20._12_4_ + auVar18._12_4_;
  auVar18 = vmulps_avx512vl(auVar255,auVar207);
  auVar20 = vshufps_avx(auVar28,auVar28,0xe1);
  auVar145._0_4_ = auVar20._0_4_ + auVar18._0_4_;
  auVar145._4_4_ = auVar20._4_4_ + auVar18._4_4_;
  auVar145._8_4_ = auVar20._8_4_ + auVar18._8_4_;
  auVar145._12_4_ = auVar20._12_4_ + auVar18._12_4_;
  auVar213._4_4_ = (float)DAT_005fc6ac;
  auVar213._0_4_ = (float)DAT_005fc6ac;
  auVar213._8_4_ = (float)DAT_005fc6ac;
  auVar213._12_4_ = (float)DAT_005fc6ac;
  auVar20 = vmulps_avx512vl(auVar213,auVar194);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = DAT_005fc6a4;
  auVar18 = vmulps_avx512vl(auVar256,auVar164);
  auVar28 = vaddps_avx512vl(auVar20,auVar145);
  auVar31 = vmulps_avx512vl(auVar256,auVar185);
  auVar20 = vshufps_avx(auVar18,auVar18,0xe1);
  auVar18._0_4_ = auVar185._0_4_ * fVar216;
  auVar18._4_4_ = auVar185._4_4_ * fVar221;
  auVar18._8_4_ = auVar185._8_4_ * 0.0;
  auVar18._12_4_ = auVar185._12_4_ * 0.0;
  auVar31 = vaddps_avx512vl(auVar20,auVar31);
  auVar17 = vbroadcastss_avx512vl(auVar21);
  auVar20 = vshufps_avx(auVar28,auVar28,0xe1);
  auVar28 = vshufps_avx(auVar18,auVar18,0xe1);
  auVar18 = vinsertps_avx512f(auVar17,ZEXT416(DAT_005fc6ac._4_4_),0x1c);
  auVar19._0_4_ = auVar18._0_4_ + auVar20._0_4_;
  auVar19._4_4_ = auVar18._4_4_ + auVar20._4_4_;
  auVar19._8_4_ = auVar18._8_4_ + auVar20._8_4_;
  auVar19._12_4_ = auVar18._12_4_ + auVar20._12_4_;
  auVar21._0_4_ = auVar207._0_4_ * fVar216;
  auVar21._4_4_ = auVar207._4_4_ * fVar221;
  auVar21._8_4_ = auVar207._8_4_ * 0.0;
  auVar21._12_4_ = auVar207._12_4_ * 0.0;
  auVar214._0_4_ = (float)DAT_005fc6ac * auVar24._0_4_ + auVar31._0_4_;
  auVar214._4_4_ = (float)DAT_005fc6ac * auVar24._4_4_ + auVar31._4_4_;
  auVar214._8_4_ = (float)DAT_005fc6ac * auVar24._8_4_ + auVar31._8_4_;
  auVar214._12_4_ = (float)DAT_005fc6ac * auVar24._12_4_ + auVar31._12_4_;
  viewMat = vmovlps_avx(auVar29);
  _DAT_005fc68c = vmovlps_avx(auVar155);
  DAT_005fc694 = vmovlps_avx512f(auVar30);
  _DAT_005fc69c = vmovlps_avx(auVar13);
  auVar24 = vmovshdup_avx(auVar21);
  auVar31 = vaddps_avx512vl(auVar17,auVar214);
  auVar20 = vmovshdup_avx(auVar22);
  auVar18 = vmovshdup_avx(auVar194);
  DAT_005fc6a4 = vmovlps_avx(auVar31);
  DAT_005fc6ac = vmovlps_avx(auVar19);
  auVar31._0_4_ = auVar164._0_4_ * fVar216 + auVar28._0_4_ + (float)DAT_005fc6bc * auVar27._0_4_;
  auVar31._4_4_ = auVar164._4_4_ * fVar221 + auVar28._4_4_ + (float)DAT_005fc6bc * auVar27._4_4_;
  auVar31._8_4_ = auVar164._8_4_ * 0.0 + auVar28._8_4_ + (float)DAT_005fc6bc * auVar27._8_4_;
  auVar31._12_4_ = auVar164._12_4_ * 0.0 + auVar28._12_4_ + (float)DAT_005fc6bc * auVar27._12_4_;
  fVar216 = auVar23._0_4_;
  auVar28 = vshufps_avx(auVar31,auVar31,0xe1);
  auVar30._0_4_ = fVar216 + auVar28._0_4_;
  auVar30._4_4_ = fVar216 + auVar28._4_4_;
  auVar30._8_4_ = fVar216 + auVar28._8_4_;
  auVar30._12_4_ = fVar216 + auVar28._12_4_;
  auVar24 = vinsertps_avx(ZEXT416((uint)(auVar24._0_4_ + auVar22._0_4_ +
                                         (float)DAT_005fc6bc * auVar18._0_4_ + fVar216)),
                          ZEXT416((uint)(DAT_005fc6bc._4_4_ +
                                        auVar194._0_4_ * (float)DAT_005fc6bc +
                                        auVar21._0_4_ + auVar20._0_4_)),0x10);
  DAT_005fc6b4 = vmovlps_avx(auVar30);
  local_1b8._0_16_ = vxorps_avx512vl(auVar12,local_178._0_16_);
  DAT_005fc6bc = vmovlps_avx(auVar24);
  fVar216 = cosf(local_1b8._0_4_);
  local_178._0_4_ = fVar216;
  auVar71._0_4_ = sinf((float)local_1b8._0_4_);
  auVar71._4_60_ = extraout_var_01;
  auVar31 = ZEXT816(0) << 0x40;
  auVar29 = vxorps_avx512vl(auVar12,auVar12);
  fVar42 = 1.0 - (float)local_178._0_4_;
  auVar27 = vmulss_avx512f(ZEXT416((uint)_DAT_005fc690),auVar29);
  fVar41 = fVar42 * 0.0;
  auVar24 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)fVar42),
                            ZEXT416((uint)(auVar71._0_4_ * 0.0)));
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar42),auVar31,ZEXT416((uint)(auVar71._0_4_ * -0.0)));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)local_178._0_4_),ZEXT416((uint)fVar41),auVar31);
  auVar18 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)fVar41),auVar71._0_16_);
  fVar216 = fVar41 + auVar71._0_4_ * 0.0;
  fVar221 = fVar41 + auVar71._0_4_ * -0.0;
  auVar31 = vfmsub213ss_fma(ZEXT416((uint)fVar41),auVar31,auVar71._0_16_);
  fVar82 = ((float)local_178._0_4_ + fVar42) * 0.0;
  fVar222 = auVar24._0_4_ * 0.0;
  fVar156 = auVar20._0_4_ * 0.0;
  fVar165 = auVar28._0_4_;
  fVar215 = fVar165 * 0.0;
  fVar93 = auVar18._0_4_ * 0.0;
  fVar41 = fVar82 + fVar222;
  fVar222 = fVar156 + (float)local_178._0_4_ + fVar42 + fVar222;
  fVar82 = fVar156 + fVar82 + auVar24._0_4_;
  fVar99 = fVar221 * 0.0;
  fVar42 = auVar20._0_4_ + fVar41;
  fVar156 = fVar156 + fVar41;
  fVar41 = fVar215 + fVar99;
  fVar221 = fVar93 + fVar215 + fVar221;
  fVar91 = auVar18._0_4_ + fVar41;
  fVar99 = fVar93 + fVar165 + fVar99;
  fVar93 = fVar93 + fVar41;
  fVar146 = fVar216 * 0.0;
  fVar2 = auVar31._0_4_ * 0.0;
  fVar41 = fVar2 + fVar146;
  fVar216 = fVar215 + fVar216 + fVar2;
  fVar146 = fVar215 + auVar31._0_4_ + fVar146;
  fVar165 = fVar165 + fVar41;
  fVar215 = fVar215 + fVar41;
  auVar24 = vmulss_avx512f(ZEXT416((uint)(float)viewMat),ZEXT416((uint)fVar222));
  auVar20 = vmulss_avx512f(ZEXT416((uint)viewMat._4_4_),ZEXT416((uint)fVar221));
  auVar18 = vmulss_avx512f(ZEXT416((uint)(float)viewMat),ZEXT416((uint)fVar82));
  auVar28 = vmulss_avx512f(ZEXT416((uint)(float)viewMat),ZEXT416((uint)fVar42));
  auVar24 = vaddss_avx512f(auVar24,auVar20);
  auVar20 = vmulss_avx512f(ZEXT416((uint)viewMat._4_4_),ZEXT416((uint)fVar99));
  auVar20 = vaddss_avx512f(auVar18,auVar20);
  auVar18 = vmulss_avx512f(ZEXT416((uint)viewMat._4_4_),ZEXT416((uint)fVar91));
  auVar18 = vaddss_avx512f(auVar28,auVar18);
  auVar24 = vaddss_avx512f(ZEXT416((uint)(DAT_005fc68c * fVar216)),auVar24);
  auVar28 = vmulss_avx512f(ZEXT416((uint)DAT_005fc68c),ZEXT416((uint)fVar146));
  auVar20 = vaddss_avx512f(auVar28,auVar20);
  auVar28 = vmulss_avx512f(ZEXT416((uint)DAT_005fc68c),ZEXT416((uint)fVar165));
  auVar18 = vaddss_avx512f(auVar28,auVar18);
  auVar24 = vaddss_avx512f(auVar27,auVar24);
  auVar20 = vaddss_avx512f(auVar27,auVar20);
  auVar28 = vmulss_avx512f(ZEXT416((uint)fVar42),ZEXT416((uint)DAT_005fc694));
  auVar24 = vinsertps_avx(auVar24,auVar20,0x10);
  auVar20 = vaddss_avx512f(auVar27,auVar18);
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar221),ZEXT416(DAT_005fc694._4_4_));
  auVar31 = vmulss_avx512f(ZEXT416((uint)fVar82),ZEXT416((uint)DAT_005fc694));
  auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)(_DAT_005fc690 +
                                                DAT_005fc68c * fVar215 +
                                                (float)viewMat * fVar156 + viewMat._4_4_ * fVar93)),
                          0x10);
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar222),ZEXT416((uint)DAT_005fc694));
  auVar22 = ZEXT416((uint)fVar156);
  auVar30 = vmulss_avx512f(auVar22,ZEXT416((uint)DAT_005fc694));
  auVar18 = vaddss_avx512f(auVar27,auVar18);
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar99),ZEXT416(DAT_005fc694._4_4_));
  auVar31 = vaddss_avx512f(auVar31,auVar27);
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar91),ZEXT416(DAT_005fc694._4_4_));
  auVar23 = ZEXT416((uint)fVar93);
  auVar17 = vmulss_avx512f(auVar23,ZEXT416(DAT_005fc694._4_4_));
  auVar30 = vaddss_avx512f(auVar30,auVar17);
  auVar17 = vmulss_avx512f(ZEXT416((uint)fVar216),ZEXT416((uint)DAT_005fc69c));
  auVar28 = vaddss_avx512f(auVar28,auVar27);
  auVar18 = vaddss_avx512f(auVar18,auVar17);
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar146),ZEXT416((uint)DAT_005fc69c));
  auVar31 = vaddss_avx512f(auVar31,auVar27);
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar165),ZEXT416((uint)DAT_005fc69c));
  auVar17 = vmulss_avx512f(ZEXT416((uint)fVar215),ZEXT416((uint)DAT_005fc69c));
  auVar30 = vaddss_avx512f(auVar30,auVar17);
  auVar17 = vmulss_avx512f(ZEXT416(_DAT_005fc6a0),auVar29);
  auVar28 = vaddss_avx512f(auVar28,auVar27);
  auVar18 = vaddss_avx512f(auVar18,auVar17);
  auVar31 = vaddss_avx512f(auVar31,auVar17);
  auVar27 = vaddss_avx512f(ZEXT416(_DAT_005fc6a0),auVar30);
  auVar30 = vmulss_avx512f(ZEXT416((uint)fVar42),ZEXT416((uint)DAT_005fc6a4));
  auVar18 = vinsertps_avx(auVar18,auVar31,0x10);
  auVar28 = vaddss_avx512f(auVar28,auVar17);
  auVar31 = vmulss_avx512f(ZEXT416((uint)fVar82),ZEXT416((uint)DAT_005fc6a4));
  auVar17 = vmulss_avx512f(ZEXT416((uint)fVar221),ZEXT416(DAT_005fc6a4._4_4_));
  auVar28 = vinsertps_avx512f(auVar28,auVar27,0x10);
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar222),ZEXT416((uint)DAT_005fc6a4));
  auVar19 = vmulss_avx512f(auVar22,ZEXT416((uint)DAT_005fc6a4));
  auVar27 = vaddss_avx512f(auVar27,auVar17);
  auVar17 = vmulss_avx512f(ZEXT416((uint)fVar99),ZEXT416(DAT_005fc6a4._4_4_));
  auVar31 = vaddss_avx512f(auVar31,auVar17);
  auVar17 = vmulss_avx512f(ZEXT416((uint)fVar91),ZEXT416(DAT_005fc6a4._4_4_));
  auVar21 = vmulss_avx512f(auVar23,ZEXT416(DAT_005fc6a4._4_4_));
  auVar30 = vaddss_avx512f(auVar30,auVar17);
  auVar17 = vaddss_avx512f(auVar19,auVar21);
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar216),ZEXT416((uint)(float)DAT_005fc6ac));
  auVar27 = vaddss_avx512f(auVar27,auVar19);
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar146),ZEXT416((uint)(float)DAT_005fc6ac));
  auVar31 = vaddss_avx512f(auVar31,auVar19);
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar165),ZEXT416((uint)(float)DAT_005fc6ac));
  auVar21 = vmulss_avx512f(ZEXT416((uint)fVar215),ZEXT416((uint)(float)DAT_005fc6ac));
  auVar30 = vaddss_avx512f(auVar30,auVar19);
  auVar17 = vaddss_avx512f(auVar17,auVar21);
  auVar19 = vmulss_avx512f(ZEXT416(DAT_005fc6ac._4_4_),auVar29);
  auVar17 = vaddss_avx512f(ZEXT416(DAT_005fc6ac._4_4_),auVar17);
  auVar27 = vaddss_avx512f(auVar27,auVar19);
  auVar31 = vaddss_avx512f(auVar31,auVar19);
  auVar31 = vinsertps_avx512f(auVar27,auVar31,0x10);
  auVar27 = vaddss_avx512f(auVar30,auVar19);
  auVar30 = vmulss_avx512f(auVar22,ZEXT416((uint)DAT_005fc6b4));
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar222),ZEXT416((uint)DAT_005fc6b4));
  auVar21 = vmulss_avx512f(ZEXT416((uint)fVar42),ZEXT416((uint)DAT_005fc6b4));
  auVar22 = vmulss_avx512f(ZEXT416((uint)fVar82),ZEXT416((uint)DAT_005fc6b4));
  auVar27 = vinsertps_avx512f(auVar27,auVar17,0x10);
  auVar17 = vmulss_avx512f(auVar23,ZEXT416(DAT_005fc6b4._4_4_));
  auVar23 = vmulss_avx512f(ZEXT416((uint)fVar221),ZEXT416(DAT_005fc6b4._4_4_));
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar91),ZEXT416(DAT_005fc6b4._4_4_));
  auVar26 = vmulss_avx512f(ZEXT416((uint)fVar99),ZEXT416(DAT_005fc6b4._4_4_));
  viewMat = vmovlps_avx(auVar24);
  _DAT_005fc68c = vmovlps_avx(auVar20);
  DAT_005fc694 = vmovlps_avx(auVar18);
  _DAT_005fc69c = vmovlps_avx(auVar28);
  DAT_005fc6a4 = vmovlps_avx512f(auVar31);
  DAT_005fc6ac = vmovlps_avx512f(auVar27);
  auVar24 = vmulss_avx512f(ZEXT416((uint)DAT_005fc6bc._4_4_),auVar29);
  fVar221 = auVar24._0_4_;
  auVar24 = vinsertps_avx(ZEXT416((uint)(auVar23._0_4_ + auVar19._0_4_ +
                                         fVar216 * (float)DAT_005fc6bc + fVar221)),
                          ZEXT416((uint)(auVar26._0_4_ + auVar22._0_4_ +
                                         fVar146 * (float)DAT_005fc6bc + fVar221)),0x10);
  DAT_005fc6b4 = vmovlps_avx(auVar24);
  auVar24 = vinsertps_avx(ZEXT416((uint)(auVar21._0_4_ + auVar25._0_4_ +
                                         fVar165 * (float)DAT_005fc6bc + fVar221)),
                          ZEXT416((uint)(DAT_005fc6bc._4_4_ +
                                        auVar30._0_4_ + auVar17._0_4_ +
                                        fVar215 * (float)DAT_005fc6bc)),0x10);
  DAT_005fc6bc = vmovlps_avx(auVar24);
switchD_001f7428_caseD_2:
  requestRedraw();
  midflight = 0;
  return;
}

Assistant:

void processRotate(glm::vec2 startP, glm::vec2 endP) {

  if (startP == endP) {
    return;
  }

  // Get frame
  glm::vec3 frameLookDir, frameUpDir, frameRightDir;
  getCameraFrame(frameLookDir, frameUpDir, frameRightDir);

  switch (getNavigateStyle()) {
  case NavigateStyle::Turntable: {

    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Translate to center
    viewMat = glm::translate(viewMat, state::center());

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, frameRightDir);
    viewMat = viewMat * phiCamR;

    // Rotation about the vertical axis
    glm::vec3 turntableUp;
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, getUpVec());
    viewMat = viewMat * thetaCamR;

    // Undo centering
    viewMat = glm::translate(viewMat, -state::center());
    break;
  }
  case NavigateStyle::Free: {
    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Translate to center
    viewMat = glm::translate(viewMat, state::center());

    // Rotation about the vertical axis
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, frameUpDir);
    viewMat = viewMat * thetaCamR;

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, frameRightDir);
    viewMat = viewMat * phiCamR;

    // Undo centering
    viewMat = glm::translate(viewMat, -state::center());
    break;
  }
  case NavigateStyle::Planar: {
    // Do nothing
    break;
  }
  case NavigateStyle::Arcball: {
    // Map inputs to unit sphere
    auto toSphere = [](glm::vec2 v) {
      double x = glm::clamp(v.x, -1.0f, 1.0f);
      double y = glm::clamp(v.y, -1.0f, 1.0f);
      double mag = x * x + y * y;
      if (mag <= 1.0) {
        return glm::vec3{x, y, -std::sqrt(1.0 - mag)};
      } else {
        return glm::normalize(glm::vec3{x, y, 0.0});
      }
    };
    glm::vec3 sphereStart = toSphere(startP);
    glm::vec3 sphereEnd = toSphere(endP);

    glm::vec3 rotAxis = -cross(sphereStart, sphereEnd);
    double rotMag = std::acos(glm::clamp(dot(sphereStart, sphereEnd), -1.0f, 1.0f) * moveScale);

    glm::mat4 cameraRotate = glm::rotate(glm::mat4x4(1.0), (float)rotMag, glm::vec3(rotAxis.x, rotAxis.y, rotAxis.z));

    // Get current camera rotation
    glm::mat4x4 R;
    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        R[i][j] = viewMat[i][j];
      }
    }
    R[3][3] = 1.0;

    glm::mat4 update = glm::inverse(R) * cameraRotate * R;

    viewMat = viewMat * update;
    break;
  }
  case NavigateStyle::None: {
    // Do nothing
    break;
  }
  case NavigateStyle::FirstPerson: {
    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Rotation about the vertical axis
    glm::vec3 rotAx = glm::mat3(viewMat) * getUpVec();
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, rotAx);
    viewMat = thetaCamR * viewMat;

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, glm::vec3(1.f, 0.f, 0.f));
    viewMat = phiCamR * viewMat;

    break;
  }
  }

  requestRedraw();
  immediatelyEndFlight();
}